

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx512::CurveNiMBIntersectorK<4,4>::
     intersect_n<embree::avx512::OrientedCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx512::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  long lVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  Primitive PVar5;
  uint uVar6;
  Geometry *pGVar7;
  __int_type_conflict _Var8;
  long lVar9;
  long lVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  int iVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  byte bVar31;
  uint uVar32;
  ulong uVar33;
  ulong uVar34;
  long lVar36;
  long lVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  ulong uVar41;
  ulong uVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 in_YmmResult [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar91 [32];
  undefined1 auVar93 [32];
  undefined1 auVar95 [32];
  undefined1 auVar97 [32];
  int iVar99;
  float fVar100;
  undefined4 uVar101;
  vint4 bi_2;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  vint4 bi_1;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [32];
  vint4 bi;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [32];
  float fVar124;
  float fVar134;
  float fVar135;
  vfloat4 a0;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  float fVar136;
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  vint4 ai_2;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  vint4 ai_1;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  float fVar162;
  float fVar177;
  vint4 ai;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  float fVar211;
  float fVar225;
  float fVar226;
  vfloat4 a0_3;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  float fVar227;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  float fVar228;
  float fVar229;
  float fVar230;
  vfloat4 b0_2;
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [64];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  float fVar256;
  float fVar265;
  vfloat4 a0_4;
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  float fVar266;
  float fVar269;
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar270 [64];
  undefined1 in_ZMM23 [64];
  undefined1 auVar271 [64];
  undefined1 auVar272 [64];
  undefined1 auVar273 [64];
  int iVar274;
  undefined1 in_ZMM31 [64];
  undefined1 auVar275 [64];
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_3d8 [8];
  float fStack_3d0;
  float fStack_3cc;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  ulong local_3a8;
  Primitive *local_3a0;
  RTCFilterFunctionNArguments local_398;
  undefined1 local_368 [16];
  undefined1 local_358 [8];
  float fStack_350;
  float fStack_34c;
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  uint auStack_308 [4];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [8];
  float fStack_2b0;
  float fStack_2ac;
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  uint uStack_148;
  float afStack_144 [7];
  RTCHitN local_128 [16];
  undefined1 local_118 [16];
  undefined4 local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined1 local_c8 [16];
  uint local_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  uint uStack_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar35;
  undefined1 auVar90 [32];
  undefined1 auVar92 [32];
  undefined1 auVar94 [32];
  undefined1 auVar96 [32];
  undefined1 auVar98 [32];
  float fVar148;
  float fVar161;
  undefined1 auVar255 [32];
  
  PVar5 = prim[1];
  uVar33 = (ulong)(byte)PVar5;
  lVar37 = uVar33 * 0x25;
  fVar100 = *(float *)(prim + lVar37 + 0x12);
  auVar43 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar43 = vinsertps_avx(auVar43,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar44 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar44 = vinsertps_avx(auVar44,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar43 = vsubps_avx(auVar43,*(undefined1 (*) [16])(prim + lVar37 + 6));
  auVar66._0_4_ = fVar100 * auVar43._0_4_;
  auVar66._4_4_ = fVar100 * auVar43._4_4_;
  auVar66._8_4_ = fVar100 * auVar43._8_4_;
  auVar66._12_4_ = fVar100 * auVar43._12_4_;
  auVar43 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar33 * 4 + 6)));
  auVar47._0_4_ = fVar100 * auVar44._0_4_;
  auVar47._4_4_ = fVar100 * auVar44._4_4_;
  auVar47._8_4_ = fVar100 * auVar44._8_4_;
  auVar47._12_4_ = fVar100 * auVar44._12_4_;
  auVar43 = vcvtdq2ps_avx(auVar43);
  auVar44 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar33 * 5 + 6)));
  auVar44 = vcvtdq2ps_avx(auVar44);
  auVar45 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar33 * 6 + 6)));
  auVar54 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar33 * 0xf + 6)));
  auVar45 = vcvtdq2ps_avx(auVar45);
  auVar54 = vcvtdq2ps_avx(auVar54);
  auVar60 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar5 * 0x10 + 6)));
  auVar60 = vcvtdq2ps_avx(auVar60);
  auVar57 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar5 * 0x10 + uVar33 + 6)));
  auVar57 = vcvtdq2ps_avx(auVar57);
  auVar58 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar33 * 0x1a + 6)));
  auVar58 = vcvtdq2ps_avx(auVar58);
  auVar59 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar33 * 0x1b + 6)));
  auVar59 = vcvtdq2ps_avx(auVar59);
  auVar61 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar33 * 0x1c + 6)));
  auVar61 = vcvtdq2ps_avx(auVar61);
  auVar149._4_4_ = auVar47._0_4_;
  auVar149._0_4_ = auVar47._0_4_;
  auVar149._8_4_ = auVar47._0_4_;
  auVar149._12_4_ = auVar47._0_4_;
  auVar62 = vshufps_avx(auVar47,auVar47,0x55);
  auVar63 = vshufps_avx(auVar47,auVar47,0xaa);
  fVar100 = auVar63._0_4_;
  auVar56._0_4_ = fVar100 * auVar45._0_4_;
  fVar230 = auVar63._4_4_;
  auVar56._4_4_ = fVar230 * auVar45._4_4_;
  fVar211 = auVar63._8_4_;
  auVar56._8_4_ = fVar211 * auVar45._8_4_;
  fVar225 = auVar63._12_4_;
  auVar56._12_4_ = fVar225 * auVar45._12_4_;
  auVar53._0_4_ = auVar57._0_4_ * fVar100;
  auVar53._4_4_ = auVar57._4_4_ * fVar230;
  auVar53._8_4_ = auVar57._8_4_ * fVar211;
  auVar53._12_4_ = auVar57._12_4_ * fVar225;
  auVar48._0_4_ = auVar61._0_4_ * fVar100;
  auVar48._4_4_ = auVar61._4_4_ * fVar230;
  auVar48._8_4_ = auVar61._8_4_ * fVar211;
  auVar48._12_4_ = auVar61._12_4_ * fVar225;
  auVar63 = vfmadd231ps_fma(auVar56,auVar62,auVar44);
  auVar19 = vfmadd231ps_fma(auVar53,auVar62,auVar60);
  auVar62 = vfmadd231ps_fma(auVar48,auVar59,auVar62);
  auVar20 = vfmadd231ps_fma(auVar63,auVar149,auVar43);
  auVar19 = vfmadd231ps_fma(auVar19,auVar149,auVar54);
  auVar21 = vfmadd231ps_fma(auVar62,auVar58,auVar149);
  auVar257._4_4_ = auVar66._0_4_;
  auVar257._0_4_ = auVar66._0_4_;
  auVar257._8_4_ = auVar66._0_4_;
  auVar257._12_4_ = auVar66._0_4_;
  auVar62 = vshufps_avx(auVar66,auVar66,0x55);
  auVar63 = vshufps_avx(auVar66,auVar66,0xaa);
  fVar100 = auVar63._0_4_;
  auVar150._0_4_ = fVar100 * auVar45._0_4_;
  fVar230 = auVar63._4_4_;
  auVar150._4_4_ = fVar230 * auVar45._4_4_;
  fVar211 = auVar63._8_4_;
  auVar150._8_4_ = fVar211 * auVar45._8_4_;
  fVar225 = auVar63._12_4_;
  auVar150._12_4_ = fVar225 * auVar45._12_4_;
  auVar137._0_4_ = auVar57._0_4_ * fVar100;
  auVar137._4_4_ = auVar57._4_4_ * fVar230;
  auVar137._8_4_ = auVar57._8_4_ * fVar211;
  auVar137._12_4_ = auVar57._12_4_ * fVar225;
  auVar125._0_4_ = auVar61._0_4_ * fVar100;
  auVar125._4_4_ = auVar61._4_4_ * fVar230;
  auVar125._8_4_ = auVar61._8_4_ * fVar211;
  auVar125._12_4_ = auVar61._12_4_ * fVar225;
  auVar44 = vfmadd231ps_fma(auVar150,auVar62,auVar44);
  auVar45 = vfmadd231ps_fma(auVar137,auVar62,auVar60);
  auVar60 = vfmadd231ps_fma(auVar125,auVar62,auVar59);
  auVar46 = vfmadd231ps_fma(auVar44,auVar257,auVar43);
  auVar47 = vfmadd231ps_fma(auVar45,auVar257,auVar54);
  auVar85._16_16_ = in_YmmResult._16_16_;
  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar271 = ZEXT1664(auVar43);
  auVar48 = vfmadd231ps_fma(auVar60,auVar257,auVar58);
  auVar44 = vandps_avx512vl(auVar20,auVar43);
  auVar178._8_4_ = 0x219392ef;
  auVar178._0_8_ = 0x219392ef219392ef;
  auVar178._12_4_ = 0x219392ef;
  uVar41 = vcmpps_avx512vl(auVar44,auVar178,1);
  bVar13 = (bool)((byte)uVar41 & 1);
  auVar49._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar20._0_4_;
  bVar13 = (bool)((byte)(uVar41 >> 1) & 1);
  auVar49._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar20._4_4_;
  bVar13 = (bool)((byte)(uVar41 >> 2) & 1);
  auVar49._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar20._8_4_;
  bVar13 = (bool)((byte)(uVar41 >> 3) & 1);
  auVar49._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar20._12_4_;
  auVar44 = vandps_avx512vl(auVar19,auVar43);
  uVar41 = vcmpps_avx512vl(auVar44,auVar178,1);
  bVar13 = (bool)((byte)uVar41 & 1);
  auVar50._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar19._0_4_;
  bVar13 = (bool)((byte)(uVar41 >> 1) & 1);
  auVar50._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar19._4_4_;
  bVar13 = (bool)((byte)(uVar41 >> 2) & 1);
  auVar50._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar19._8_4_;
  bVar13 = (bool)((byte)(uVar41 >> 3) & 1);
  auVar50._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar19._12_4_;
  auVar43 = vandps_avx512vl(auVar21,auVar43);
  uVar41 = vcmpps_avx512vl(auVar43,auVar178,1);
  bVar13 = (bool)((byte)uVar41 & 1);
  auVar51._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar21._0_4_;
  bVar13 = (bool)((byte)(uVar41 >> 1) & 1);
  auVar51._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar21._4_4_;
  bVar13 = (bool)((byte)(uVar41 >> 2) & 1);
  auVar51._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar21._8_4_;
  bVar13 = (bool)((byte)(uVar41 >> 3) & 1);
  auVar51._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar21._12_4_;
  auVar43 = vrcp14ps_avx512vl(auVar49);
  auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar272 = ZEXT1664(auVar44);
  auVar45 = vfnmadd213ps_avx512vl(auVar49,auVar43,auVar44);
  auVar20 = vfmadd132ps_fma(auVar45,auVar43,auVar43);
  auVar43 = vrcp14ps_avx512vl(auVar50);
  auVar45 = vfnmadd213ps_avx512vl(auVar50,auVar43,auVar44);
  auVar21 = vfmadd132ps_fma(auVar45,auVar43,auVar43);
  auVar43 = vrcp14ps_avx512vl(auVar51);
  auVar44 = vfnmadd213ps_avx512vl(auVar51,auVar43,auVar44);
  auVar64 = vfmadd132ps_fma(auVar44,auVar43,auVar43);
  fVar100 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar37 + 0x16)) *
            *(float *)(prim + lVar37 + 0x1a);
  auVar163._4_4_ = fVar100;
  auVar163._0_4_ = fVar100;
  auVar163._8_4_ = fVar100;
  auVar163._12_4_ = fVar100;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *(ulong *)(prim + uVar33 * 7 + 6);
  auVar43 = vpmovsxwd_avx(auVar43);
  auVar43 = vcvtdq2ps_avx(auVar43);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *(ulong *)(prim + uVar33 * 0xb + 6);
  auVar44 = vpmovsxwd_avx(auVar44);
  auVar44 = vcvtdq2ps_avx(auVar44);
  auVar54 = vsubps_avx(auVar44,auVar43);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *(ulong *)(prim + uVar33 * 9 + 6);
  auVar44 = vpmovsxwd_avx(auVar45);
  auVar45 = vfmadd213ps_fma(auVar54,auVar163,auVar43);
  auVar43 = vcvtdq2ps_avx(auVar44);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = *(ulong *)(prim + uVar33 * 0xd + 6);
  auVar44 = vpmovsxwd_avx(auVar54);
  auVar44 = vcvtdq2ps_avx(auVar44);
  auVar44 = vsubps_avx(auVar44,auVar43);
  auVar54 = vfmadd213ps_fma(auVar44,auVar163,auVar43);
  auVar60._8_8_ = 0;
  auVar60._0_8_ = *(ulong *)(prim + uVar33 * 0x12 + 6);
  auVar43 = vpmovsxwd_avx(auVar60);
  auVar43 = vcvtdq2ps_avx(auVar43);
  uVar41 = (ulong)(uint)((int)(uVar33 * 5) << 2);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = *(ulong *)(prim + uVar33 * 2 + uVar41 + 6);
  auVar44 = vpmovsxwd_avx(auVar57);
  auVar44 = vcvtdq2ps_avx(auVar44);
  auVar44 = vsubps_avx(auVar44,auVar43);
  auVar60 = vfmadd213ps_fma(auVar44,auVar163,auVar43);
  auVar58._8_8_ = 0;
  auVar58._0_8_ = *(ulong *)(prim + uVar41 + 6);
  auVar43 = vpmovsxwd_avx(auVar58);
  auVar43 = vcvtdq2ps_avx(auVar43);
  auVar59._8_8_ = 0;
  auVar59._0_8_ = *(ulong *)(prim + uVar33 * 0x18 + 6);
  auVar44 = vpmovsxwd_avx(auVar59);
  auVar44 = vcvtdq2ps_avx(auVar44);
  auVar44 = vsubps_avx(auVar44,auVar43);
  auVar57 = vfmadd213ps_fma(auVar44,auVar163,auVar43);
  auVar61._8_8_ = 0;
  auVar61._0_8_ = *(ulong *)(prim + uVar33 * 0x1d + 6);
  auVar43 = vpmovsxwd_avx(auVar61);
  auVar43 = vcvtdq2ps_avx(auVar43);
  auVar62._8_8_ = 0;
  auVar62._0_8_ = *(ulong *)(prim + uVar33 + (ulong)(byte)PVar5 * 0x20 + 6);
  auVar44 = vpmovsxwd_avx(auVar62);
  auVar44 = vcvtdq2ps_avx(auVar44);
  auVar44 = vsubps_avx(auVar44,auVar43);
  auVar58 = vfmadd213ps_fma(auVar44,auVar163,auVar43);
  auVar63._8_8_ = 0;
  auVar63._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar5 * 0x20 - uVar33) + 6);
  auVar43 = vpmovsxwd_avx(auVar63);
  auVar43 = vcvtdq2ps_avx(auVar43);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar33 * 0x23 + 6);
  auVar44 = vpmovsxwd_avx(auVar19);
  auVar44 = vcvtdq2ps_avx(auVar44);
  auVar44 = vsubps_avx(auVar44,auVar43);
  auVar44 = vfmadd213ps_fma(auVar44,auVar163,auVar43);
  auVar43 = vsubps_avx(auVar45,auVar46);
  auVar164._0_4_ = auVar20._0_4_ * auVar43._0_4_;
  auVar164._4_4_ = auVar20._4_4_ * auVar43._4_4_;
  auVar164._8_4_ = auVar20._8_4_ * auVar43._8_4_;
  auVar164._12_4_ = auVar20._12_4_ * auVar43._12_4_;
  auVar43 = vsubps_avx(auVar54,auVar46);
  auVar65._0_4_ = auVar20._0_4_ * auVar43._0_4_;
  auVar65._4_4_ = auVar20._4_4_ * auVar43._4_4_;
  auVar65._8_4_ = auVar20._8_4_ * auVar43._8_4_;
  auVar65._12_4_ = auVar20._12_4_ * auVar43._12_4_;
  auVar43 = vsubps_avx(auVar60,auVar47);
  auVar151._0_4_ = auVar21._0_4_ * auVar43._0_4_;
  auVar151._4_4_ = auVar21._4_4_ * auVar43._4_4_;
  auVar151._8_4_ = auVar21._8_4_ * auVar43._8_4_;
  auVar151._12_4_ = auVar21._12_4_ * auVar43._12_4_;
  auVar43 = vsubps_avx(auVar57,auVar47);
  auVar55._0_4_ = auVar21._0_4_ * auVar43._0_4_;
  auVar55._4_4_ = auVar21._4_4_ * auVar43._4_4_;
  auVar55._8_4_ = auVar21._8_4_ * auVar43._8_4_;
  auVar55._12_4_ = auVar21._12_4_ * auVar43._12_4_;
  auVar43 = vsubps_avx(auVar58,auVar48);
  auVar138._0_4_ = auVar64._0_4_ * auVar43._0_4_;
  auVar138._4_4_ = auVar64._4_4_ * auVar43._4_4_;
  auVar138._8_4_ = auVar64._8_4_ * auVar43._8_4_;
  auVar138._12_4_ = auVar64._12_4_ * auVar43._12_4_;
  auVar43 = vsubps_avx(auVar44,auVar48);
  auVar52._0_4_ = auVar64._0_4_ * auVar43._0_4_;
  auVar52._4_4_ = auVar64._4_4_ * auVar43._4_4_;
  auVar52._8_4_ = auVar64._8_4_ * auVar43._8_4_;
  auVar52._12_4_ = auVar64._12_4_ * auVar43._12_4_;
  auVar43 = vpminsd_avx(auVar164,auVar65);
  auVar44 = vpminsd_avx(auVar151,auVar55);
  auVar43 = vmaxps_avx(auVar43,auVar44);
  auVar44 = vpminsd_avx(auVar138,auVar52);
  uVar101 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar20._4_4_ = uVar101;
  auVar20._0_4_ = uVar101;
  auVar20._8_4_ = uVar101;
  auVar20._12_4_ = uVar101;
  auVar44 = vmaxps_avx512vl(auVar44,auVar20);
  auVar43 = vmaxps_avx(auVar43,auVar44);
  auVar21._8_4_ = 0x3f7ffffa;
  auVar21._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar21._12_4_ = 0x3f7ffffa;
  local_2c8 = vmulps_avx512vl(auVar43,auVar21);
  auVar43 = vpmaxsd_avx(auVar164,auVar65);
  auVar44 = vpmaxsd_avx(auVar151,auVar55);
  auVar43 = vminps_avx(auVar43,auVar44);
  auVar44 = vpmaxsd_avx(auVar138,auVar52);
  uVar101 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar64._4_4_ = uVar101;
  auVar64._0_4_ = uVar101;
  auVar64._8_4_ = uVar101;
  auVar64._12_4_ = uVar101;
  auVar44 = vminps_avx512vl(auVar44,auVar64);
  auVar43 = vminps_avx(auVar43,auVar44);
  auVar46._8_4_ = 0x3f800003;
  auVar46._0_8_ = 0x3f8000033f800003;
  auVar46._12_4_ = 0x3f800003;
  auVar43 = vmulps_avx512vl(auVar43,auVar46);
  auVar44 = vpbroadcastd_avx512vl();
  uVar17 = vcmpps_avx512vl(local_2c8,auVar43,2);
  uVar41 = vpcmpgtd_avx512vl(auVar44,_DAT_01ff0cf0);
  uVar41 = ((byte)uVar17 & 0xf) & uVar41;
  if ((char)uVar41 == '\0') {
    return;
  }
  local_2f8 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar43 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
  auVar275 = ZEXT1664(auVar43);
  local_3a0 = prim;
LAB_01c5978e:
  lVar37 = 0;
  for (uVar33 = uVar41; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000) {
    lVar37 = lVar37 + 1;
  }
  uVar33 = (ulong)*(uint *)(local_3a0 + 2);
  pGVar7 = (context->scene->geometries).items[uVar33].ptr;
  fVar100 = (pGVar7->time_range).lower;
  fVar211 = pGVar7->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar100) / ((pGVar7->time_range).upper - fVar100));
  auVar43 = vroundss_avx(ZEXT416((uint)fVar211),ZEXT416((uint)fVar211),9);
  uVar38 = *(uint *)(local_3a0 + lVar37 * 4 + 6);
  auVar44 = vaddss_avx512f(ZEXT416((uint)pGVar7->fnumTimeSegments),SUB6416(ZEXT464(0xbf800000),0));
  auVar43 = vminss_avx(auVar43,auVar44);
  auVar46 = vmaxss_avx512f(auVar275._0_16_,auVar43);
  uVar34 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           (ulong)uVar38 *
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var8 = pGVar7[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar36 = (long)(int)auVar46._0_4_ * 0x38;
  lVar9 = *(long *)(_Var8 + lVar36);
  lVar10 = *(long *)(_Var8 + 0x10 + lVar36);
  auVar43 = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar34);
  lVar37 = uVar34 + 1;
  auVar44 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar37);
  lVar1 = uVar34 + 2;
  auVar45 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar1);
  lVar2 = uVar34 + 3;
  auVar54 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar2);
  lVar9 = *(long *)&pGVar7[4].fnumTimeSegments;
  lVar10 = *(long *)(lVar9 + lVar36);
  lVar11 = *(long *)(lVar9 + 0x10 + lVar36);
  auVar60 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar34);
  auVar57 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar37);
  auVar58 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  auVar59 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar2);
  lVar10 = *(long *)(_Var8 + 0x38 + lVar36);
  lVar11 = *(long *)(_Var8 + 0x48 + lVar36);
  auVar61 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar34);
  auVar62 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar37);
  auVar63 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  auVar19 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar2);
  lVar10 = *(long *)(lVar9 + 0x38 + lVar36);
  lVar9 = *(long *)(lVar9 + 0x48 + lVar36);
  auVar20 = *(undefined1 (*) [16])(lVar10 + uVar34 * lVar9);
  auVar21 = *(undefined1 (*) [16])(lVar10 + lVar37 * lVar9);
  auVar64 = *(undefined1 (*) [16])(lVar10 + lVar1 * lVar9);
  fVar211 = fVar211 - auVar46._0_4_;
  auVar81._0_16_ = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
  auVar46 = vmulps_avx512vl(auVar54,auVar81._0_16_);
  auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaab));
  auVar48 = vfmadd213ps_avx512vl(auVar47,auVar45,auVar46);
  auVar49 = vbroadcastss_avx512vl(ZEXT416(0x3f2aaaab));
  auVar48 = vfmadd231ps_avx512vl(auVar48,auVar44,auVar49);
  auVar48 = vfmadd231ps_avx512vl(auVar48,auVar43,auVar47);
  auVar50 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar46 = vfmadd231ps_avx512vl(auVar46,auVar45,auVar50);
  auVar46 = vfnmadd231ps_avx512vl(auVar46,auVar44,auVar81._0_16_);
  auVar46 = vfnmadd231ps_avx512vl(auVar46,auVar43,auVar50);
  auVar51 = vmulps_avx512vl(auVar59,auVar81._0_16_);
  auVar52 = vfmadd213ps_avx512vl(auVar47,auVar58,auVar51);
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar57,auVar49);
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar60,auVar47);
  auVar51 = vfmadd231ps_avx512vl(auVar51,auVar58,auVar50);
  auVar51 = vfnmadd231ps_avx512vl(auVar51,auVar57,auVar81._0_16_);
  auVar51 = vfnmadd231ps_avx512vl(auVar51,auVar60,auVar50);
  auVar53 = vmulps_avx512vl(auVar54,auVar47);
  auVar53 = vfmadd231ps_avx512vl(auVar53,auVar45,auVar49);
  auVar53 = vfmadd231ps_avx512vl(auVar53,auVar44,auVar47);
  auVar53 = vfmadd231ps_avx512vl(auVar53,auVar43,auVar81._0_16_);
  auVar54 = vmulps_avx512vl(auVar54,auVar50);
  auVar45 = vfmadd231ps_avx512vl(auVar54,auVar81._0_16_,auVar45);
  auVar44 = vfnmadd231ps_avx512vl(auVar45,auVar50,auVar44);
  auVar55 = vfnmadd231ps_avx512vl(auVar44,auVar81._0_16_,auVar43);
  auVar43 = vmulps_avx512vl(auVar59,auVar47);
  auVar43 = vfmadd231ps_avx512vl(auVar43,auVar58,auVar49);
  auVar43 = vfmadd231ps_avx512vl(auVar43,auVar57,auVar47);
  auVar56 = vfmadd231ps_avx512vl(auVar43,auVar60,auVar81._0_16_);
  auVar43 = vmulps_avx512vl(auVar59,auVar50);
  auVar43 = vfmadd231ps_avx512vl(auVar43,auVar81._0_16_,auVar58);
  auVar43 = vfnmadd231ps_avx512vl(auVar43,auVar50,auVar57);
  auVar57 = vfnmadd231ps_avx512vl(auVar43,auVar81._0_16_,auVar60);
  auVar44 = vshufps_avx512vl(auVar46,auVar46,0xc9);
  auVar43 = vshufps_avx512vl(auVar52,auVar52,0xc9);
  auVar43 = vmulps_avx512vl(auVar46,auVar43);
  auVar43 = vfmsub231ps_avx512vl(auVar43,auVar44,auVar52);
  auVar45 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar43 = vshufps_avx(auVar51,auVar51,0xc9);
  auVar43 = vmulps_avx512vl(auVar46,auVar43);
  auVar43 = vfmsub231ps_fma(auVar43,auVar44,auVar51);
  auVar54 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar43 = vshufps_avx(auVar55,auVar55,0xc9);
  auVar44 = vshufps_avx(auVar56,auVar56,0xc9);
  auVar165._0_4_ = auVar55._0_4_ * auVar44._0_4_;
  auVar165._4_4_ = auVar55._4_4_ * auVar44._4_4_;
  auVar165._8_4_ = auVar55._8_4_ * auVar44._8_4_;
  auVar165._12_4_ = auVar55._12_4_ * auVar44._12_4_;
  auVar44 = vfmsub231ps_fma(auVar165,auVar43,auVar56);
  auVar60 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar44 = vshufps_avx(auVar57,auVar57,0xc9);
  auVar166._0_4_ = auVar55._0_4_ * auVar44._0_4_;
  auVar166._4_4_ = auVar55._4_4_ * auVar44._4_4_;
  auVar166._8_4_ = auVar55._8_4_ * auVar44._8_4_;
  auVar166._12_4_ = auVar55._12_4_ * auVar44._12_4_;
  auVar43 = vfmsub231ps_fma(auVar166,auVar43,auVar57);
  auVar57 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar43 = vdpps_avx(auVar45,auVar45,0x7f);
  auVar81._16_16_ = auVar85._16_16_;
  auVar67._4_28_ = auVar81._4_28_;
  auVar67._0_4_ = auVar43._0_4_;
  auVar44 = vrsqrt14ss_avx512f(auVar81._0_16_,auVar67._0_16_);
  auVar58 = vmulss_avx512f(auVar44,ZEXT416(0x3fc00000));
  auVar59 = vmulss_avx512f(auVar43,SUB6416(ZEXT464(0xbf000000),0));
  auVar59 = vmulss_avx512f(auVar59,auVar44);
  auVar44 = vmulss_avx512f(auVar59,ZEXT416((uint)(auVar44._0_4_ * auVar44._0_4_)));
  fVar100 = auVar58._0_4_ + auVar44._0_4_;
  auVar190._4_4_ = fVar100;
  auVar190._0_4_ = fVar100;
  auVar190._8_4_ = fVar100;
  auVar190._12_4_ = fVar100;
  auVar44 = vdpps_avx(auVar45,auVar54,0x7f);
  auVar58 = vmulps_avx512vl(auVar45,auVar190);
  auVar59 = vbroadcastss_avx512vl(auVar43);
  auVar54 = vmulps_avx512vl(auVar59,auVar54);
  fVar230 = auVar44._0_4_;
  auVar152._0_4_ = fVar230 * auVar45._0_4_;
  auVar152._4_4_ = fVar230 * auVar45._4_4_;
  auVar152._8_4_ = fVar230 * auVar45._8_4_;
  auVar152._12_4_ = fVar230 * auVar45._12_4_;
  auVar45 = vsubps_avx(auVar54,auVar152);
  auVar44 = vrcp14ss_avx512f(auVar81._0_16_,auVar67._0_16_);
  auVar43 = vfnmadd213ss_avx512f(auVar43,auVar44,ZEXT416(0x40000000));
  fVar225 = auVar44._0_4_ * auVar43._0_4_;
  auVar43 = vdpps_avx(auVar60,auVar60,0x7f);
  auVar83._16_16_ = auVar85._16_16_;
  auVar83._0_16_ = auVar81._0_16_;
  auVar84._4_28_ = auVar83._4_28_;
  auVar84._0_4_ = auVar43._0_4_;
  auVar44 = vrsqrt14ss_avx512f(auVar81._0_16_,auVar84._0_16_);
  auVar54 = vmulss_avx512f(auVar44,ZEXT416(0x3fc00000));
  fVar230 = auVar44._0_4_;
  fVar230 = auVar54._0_4_ + auVar43._0_4_ * -0.5 * fVar230 * fVar230 * fVar230;
  auVar191._0_4_ = auVar60._0_4_ * fVar230;
  auVar191._4_4_ = auVar60._4_4_ * fVar230;
  auVar191._8_4_ = auVar60._8_4_ * fVar230;
  auVar191._12_4_ = auVar60._12_4_ * fVar230;
  auVar44 = vdpps_avx(auVar60,auVar57,0x7f);
  auVar54 = vbroadcastss_avx512vl(auVar43);
  auVar54 = vmulps_avx512vl(auVar54,auVar57);
  fVar226 = auVar44._0_4_;
  auVar107._0_4_ = fVar226 * auVar60._0_4_;
  auVar107._4_4_ = fVar226 * auVar60._4_4_;
  auVar107._8_4_ = fVar226 * auVar60._8_4_;
  auVar107._12_4_ = fVar226 * auVar60._12_4_;
  auVar44 = vsubps_avx(auVar54,auVar107);
  auVar54 = vrcp14ss_avx512f(auVar81._0_16_,auVar84._0_16_);
  auVar43 = vfnmadd213ss_avx512f(auVar43,auVar54,ZEXT416(0x40000000));
  fVar226 = auVar54._0_4_ * auVar43._0_4_;
  auVar43 = vshufps_avx512vl(auVar48,auVar48,0xff);
  auVar54 = vmulps_avx512vl(auVar43,auVar58);
  auVar51 = vsubps_avx512vl(auVar48,auVar54);
  auVar60 = vshufps_avx512vl(auVar46,auVar46,0xff);
  auVar60 = vmulps_avx512vl(auVar60,auVar58);
  auVar139._0_4_ = auVar60._0_4_ + auVar43._0_4_ * fVar100 * fVar225 * auVar45._0_4_;
  auVar139._4_4_ = auVar60._4_4_ + auVar43._4_4_ * fVar100 * fVar225 * auVar45._4_4_;
  auVar139._8_4_ = auVar60._8_4_ + auVar43._8_4_ * fVar100 * fVar225 * auVar45._8_4_;
  auVar139._12_4_ = auVar60._12_4_ + auVar43._12_4_ * fVar100 * fVar225 * auVar45._12_4_;
  auVar45 = vsubps_avx512vl(auVar46,auVar139);
  auVar48 = vaddps_avx512vl(auVar48,auVar54);
  auVar54 = vaddps_avx512vl(auVar46,auVar139);
  auVar43 = vshufps_avx512vl(auVar53,auVar53,0xff);
  auVar60 = vmulps_avx512vl(auVar43,auVar191);
  auVar46 = vsubps_avx512vl(auVar53,auVar60);
  auVar57 = vshufps_avx512vl(auVar55,auVar55,0xff);
  auVar57 = vmulps_avx512vl(auVar57,auVar191);
  auVar192._0_4_ = auVar57._0_4_ + auVar43._0_4_ * fVar230 * auVar44._0_4_ * fVar226;
  auVar192._4_4_ = auVar57._4_4_ + auVar43._4_4_ * fVar230 * auVar44._4_4_ * fVar226;
  auVar192._8_4_ = auVar57._8_4_ + auVar43._8_4_ * fVar230 * auVar44._8_4_ * fVar226;
  auVar192._12_4_ = auVar57._12_4_ + auVar43._12_4_ * fVar230 * auVar44._12_4_ * fVar226;
  auVar43 = vsubps_avx(auVar55,auVar192);
  auVar52 = vaddps_avx512vl(auVar53,auVar60);
  auVar44 = vaddps_avx512vl(auVar55,auVar192);
  auVar102._8_4_ = 0x3eaaaaab;
  auVar102._0_8_ = 0x3eaaaaab3eaaaaab;
  auVar102._12_4_ = 0x3eaaaaab;
  auVar179._0_4_ = auVar51._0_4_ + auVar45._0_4_ * 0.33333334;
  auVar179._4_4_ = auVar51._4_4_ + auVar45._4_4_ * 0.33333334;
  auVar179._8_4_ = auVar51._8_4_ + auVar45._8_4_ * 0.33333334;
  auVar179._12_4_ = auVar51._12_4_ + auVar45._12_4_ * 0.33333334;
  auVar167._0_4_ = auVar43._0_4_ * 0.33333334;
  auVar167._4_4_ = auVar43._4_4_ * 0.33333334;
  auVar167._8_4_ = auVar43._8_4_ * 0.33333334;
  auVar167._12_4_ = auVar43._12_4_ * 0.33333334;
  auVar58 = vsubps_avx(auVar46,auVar167);
  local_3d8._4_4_ = auVar48._4_4_ + auVar54._4_4_ * 0.33333334;
  local_3d8._0_4_ = auVar48._0_4_ + auVar54._0_4_ * 0.33333334;
  fStack_3d0 = auVar48._8_4_ + auVar54._8_4_ * 0.33333334;
  fStack_3cc = auVar48._12_4_ + auVar54._12_4_ * 0.33333334;
  auVar43 = vmulps_avx512vl(auVar44,auVar102);
  auVar59 = vsubps_avx(auVar52,auVar43);
  auVar43 = *(undefined1 (*) [16])(lVar10 + lVar9 * lVar2);
  auVar44 = vmulps_avx512vl(auVar19,auVar81._0_16_);
  auVar45 = vfmadd213ps_avx512vl(auVar47,auVar63,auVar44);
  auVar45 = vfmadd231ps_avx512vl(auVar45,auVar62,auVar49);
  auVar53 = vfmadd231ps_avx512vl(auVar45,auVar61,auVar47);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar63,auVar50);
  auVar44 = vfnmadd231ps_avx512vl(auVar44,auVar62,auVar81._0_16_);
  auVar55 = vfnmadd231ps_avx512vl(auVar44,auVar61,auVar50);
  auVar44 = vmulps_avx512vl(auVar43,auVar81._0_16_);
  auVar45 = vfmadd213ps_avx512vl(auVar47,auVar64,auVar44);
  auVar45 = vfmadd231ps_avx512vl(auVar45,auVar21,auVar49);
  auVar45 = vfmadd231ps_avx512vl(auVar45,auVar20,auVar47);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar64,auVar50);
  auVar44 = vfnmadd231ps_avx512vl(auVar44,auVar21,auVar81._0_16_);
  auVar44 = vfnmadd231ps_avx512vl(auVar44,auVar20,auVar50);
  auVar54 = vmulps_avx512vl(auVar19,auVar47);
  auVar54 = vfmadd231ps_avx512vl(auVar54,auVar63,auVar49);
  auVar54 = vfmadd231ps_avx512vl(auVar54,auVar62,auVar47);
  auVar56 = vfmadd231ps_avx512vl(auVar54,auVar61,auVar81._0_16_);
  auVar54 = vmulps_avx512vl(auVar19,auVar50);
  auVar54 = vfmadd231ps_avx512vl(auVar54,auVar81._0_16_,auVar63);
  auVar54 = vfnmadd231ps_avx512vl(auVar54,auVar50,auVar62);
  auVar61 = vfnmadd231ps_avx512vl(auVar54,auVar81._0_16_,auVar61);
  auVar54 = vmulps_avx512vl(auVar43,auVar47);
  auVar54 = vfmadd231ps_avx512vl(auVar54,auVar64,auVar49);
  auVar54 = vfmadd231ps_avx512vl(auVar54,auVar21,auVar47);
  auVar60 = vfmadd231ps_avx512vl(auVar54,auVar20,auVar81._0_16_);
  auVar43 = vmulps_avx512vl(auVar43,auVar50);
  auVar43 = vfmadd231ps_avx512vl(auVar43,auVar81._0_16_,auVar64);
  auVar43 = vfnmadd231ps_avx512vl(auVar43,auVar50,auVar21);
  auVar57 = vfnmadd231ps_avx512vl(auVar43,auVar81._0_16_,auVar20);
  auVar43 = vshufps_avx(auVar55,auVar55,0xc9);
  auVar54 = vshufps_avx512vl(auVar45,auVar45,0xc9);
  fVar226 = auVar55._0_4_;
  auVar237._0_4_ = fVar226 * auVar54._0_4_;
  fVar148 = auVar55._4_4_;
  auVar237._4_4_ = fVar148 * auVar54._4_4_;
  fVar161 = auVar55._8_4_;
  auVar237._8_4_ = fVar161 * auVar54._8_4_;
  fVar162 = auVar55._12_4_;
  auVar237._12_4_ = fVar162 * auVar54._12_4_;
  auVar45 = vfmsub231ps_avx512vl(auVar237,auVar43,auVar45);
  auVar45 = vshufps_avx(auVar45,auVar45,0xc9);
  auVar54 = vshufps_avx512vl(auVar44,auVar44,0xc9);
  auVar247._0_4_ = fVar226 * auVar54._0_4_;
  auVar247._4_4_ = fVar148 * auVar54._4_4_;
  auVar247._8_4_ = fVar161 * auVar54._8_4_;
  auVar247._12_4_ = fVar162 * auVar54._12_4_;
  auVar43 = vfmsub231ps_avx512vl(auVar247,auVar43,auVar44);
  auVar54 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar62 = vshufps_avx512vl(auVar61,auVar61,0xc9);
  auVar43 = vshufps_avx(auVar60,auVar60,0xc9);
  auVar43 = vmulps_avx512vl(auVar61,auVar43);
  auVar43 = vfmsub231ps_fma(auVar43,auVar62,auVar60);
  auVar60 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar44 = vshufps_avx(auVar57,auVar57,0xc9);
  auVar43 = vdpps_avx(auVar45,auVar45,0x7f);
  auVar44 = vmulps_avx512vl(auVar61,auVar44);
  auVar44 = vfmsub231ps_fma(auVar44,auVar62,auVar57);
  auVar57 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar68._16_16_ = auVar85._16_16_;
  auVar68._0_16_ = auVar81._0_16_;
  auVar69._4_28_ = auVar68._4_28_;
  auVar69._0_4_ = auVar43._0_4_;
  auVar44 = vrsqrt14ss_avx512f(auVar81._0_16_,auVar69._0_16_);
  auVar62 = vmulss_avx512f(auVar44,ZEXT416(0x3fc00000));
  auVar63 = vmulss_avx512f(auVar43,ZEXT416(0xbf000000));
  auVar63 = vmulss_avx512f(auVar63,auVar44);
  auVar44 = vmulss_avx512f(auVar63,ZEXT416((uint)(auVar44._0_4_ * auVar44._0_4_)));
  auVar44 = vaddss_avx512f(auVar62,auVar44);
  auVar267._0_4_ = auVar44._0_4_;
  auVar267._4_4_ = auVar267._0_4_;
  auVar267._8_4_ = auVar267._0_4_;
  auVar267._12_4_ = auVar267._0_4_;
  auVar62 = vmulps_avx512vl(auVar45,auVar267);
  auVar44 = vdpps_avx(auVar45,auVar54,0x7f);
  auVar63 = vbroadcastss_avx512vl(auVar43);
  auVar54 = vmulps_avx512vl(auVar63,auVar54);
  fVar100 = auVar44._0_4_;
  auVar168._0_4_ = auVar45._0_4_ * fVar100;
  auVar168._4_4_ = auVar45._4_4_ * fVar100;
  auVar168._8_4_ = auVar45._8_4_ * fVar100;
  auVar168._12_4_ = auVar45._12_4_ * fVar100;
  auVar45 = vsubps_avx(auVar54,auVar168);
  auVar44 = vrcp14ss_avx512f(auVar81._0_16_,auVar69._0_16_);
  auVar43 = vfnmadd213ss_avx512f(auVar43,auVar44,ZEXT416(0x40000000));
  fVar230 = auVar44._0_4_ * auVar43._0_4_;
  auVar43 = vdpps_avx(auVar60,auVar60,0x7f);
  auVar70._16_16_ = auVar85._16_16_;
  auVar70._0_16_ = auVar81._0_16_;
  auVar71._4_28_ = auVar70._4_28_;
  auVar71._0_4_ = auVar43._0_4_;
  auVar44 = vrsqrt14ss_avx512f(auVar81._0_16_,auVar71._0_16_);
  auVar54 = vmulss_avx512f(auVar44,ZEXT416(0x3fc00000));
  auVar273 = ZEXT464(0x3f800000);
  auVar63 = vmulss_avx512f(auVar43,ZEXT416(0xbf000000));
  fVar100 = auVar44._0_4_;
  fVar100 = auVar54._0_4_ + auVar63._0_4_ * fVar100 * fVar100 * fVar100;
  auVar258._0_4_ = auVar60._0_4_ * fVar100;
  auVar258._4_4_ = auVar60._4_4_ * fVar100;
  auVar258._8_4_ = auVar60._8_4_ * fVar100;
  auVar258._12_4_ = auVar60._12_4_ * fVar100;
  auVar44 = vdpps_avx(auVar60,auVar57,0x7f);
  auVar54 = vbroadcastss_avx512vl(auVar43);
  auVar54 = vmulps_avx512vl(auVar54,auVar57);
  fVar225 = auVar44._0_4_;
  auVar212._0_4_ = fVar225 * auVar60._0_4_;
  auVar212._4_4_ = fVar225 * auVar60._4_4_;
  auVar212._8_4_ = fVar225 * auVar60._8_4_;
  auVar212._12_4_ = fVar225 * auVar60._12_4_;
  auVar44 = vsubps_avx(auVar54,auVar212);
  auVar54 = vrcp14ss_avx512f(auVar81._0_16_,auVar71._0_16_);
  auVar43 = vfnmadd213ss_avx512f(auVar43,auVar54,ZEXT416(0x40000000));
  fVar225 = auVar43._0_4_ * auVar54._0_4_;
  auVar54 = vshufps_avx512vl(auVar53,auVar53,0xff);
  auVar60 = vmulps_avx512vl(auVar54,auVar62);
  auVar57 = vsubps_avx512vl(auVar53,auVar60);
  auVar43 = vshufps_avx(auVar55,auVar55,0xff);
  auVar43 = vmulps_avx512vl(auVar43,auVar62);
  auVar153._0_4_ = auVar43._0_4_ + auVar54._0_4_ * auVar267._0_4_ * fVar230 * auVar45._0_4_;
  auVar153._4_4_ = auVar43._4_4_ + auVar54._4_4_ * auVar267._0_4_ * fVar230 * auVar45._4_4_;
  auVar153._8_4_ = auVar43._8_4_ + auVar54._8_4_ * auVar267._0_4_ * fVar230 * auVar45._8_4_;
  auVar153._12_4_ = auVar43._12_4_ + auVar54._12_4_ * auVar267._0_4_ * fVar230 * auVar45._12_4_;
  auVar43 = vsubps_avx(auVar55,auVar153);
  auVar45 = vaddps_avx512vl(auVar53,auVar60);
  auVar54 = vshufps_avx512vl(auVar56,auVar56,0xff);
  auVar248._0_4_ = auVar54._0_4_ * auVar258._0_4_;
  auVar248._4_4_ = auVar54._4_4_ * auVar258._4_4_;
  auVar248._8_4_ = auVar54._8_4_ * auVar258._8_4_;
  auVar248._12_4_ = auVar54._12_4_ * auVar258._12_4_;
  auVar60 = vsubps_avx512vl(auVar56,auVar248);
  auVar62 = vshufps_avx512vl(auVar61,auVar61,0xff);
  auVar62 = vmulps_avx512vl(auVar62,auVar258);
  auVar169._0_4_ = auVar62._0_4_ + auVar54._0_4_ * fVar100 * auVar44._0_4_ * fVar225;
  auVar169._4_4_ = auVar62._4_4_ + auVar54._4_4_ * fVar100 * auVar44._4_4_ * fVar225;
  auVar169._8_4_ = auVar62._8_4_ + auVar54._8_4_ * fVar100 * auVar44._8_4_ * fVar225;
  auVar169._12_4_ = auVar62._12_4_ + auVar54._12_4_ * fVar100 * auVar44._12_4_ * fVar225;
  auVar44 = vsubps_avx512vl(auVar61,auVar169);
  auVar54 = vaddps_avx512vl(auVar56,auVar248);
  auVar61 = vaddps_avx512vl(auVar61,auVar169);
  auVar213._0_4_ = auVar57._0_4_ + auVar43._0_4_ * 0.33333334;
  auVar213._4_4_ = auVar57._4_4_ + auVar43._4_4_ * 0.33333334;
  auVar213._8_4_ = auVar57._8_4_ + auVar43._8_4_ * 0.33333334;
  auVar213._12_4_ = auVar57._12_4_ + auVar43._12_4_ * 0.33333334;
  auVar204._0_4_ = auVar44._0_4_ * 0.33333334;
  auVar204._4_4_ = auVar44._4_4_ * 0.33333334;
  auVar204._8_4_ = auVar44._8_4_ * 0.33333334;
  auVar204._12_4_ = auVar44._12_4_ * 0.33333334;
  auVar43 = vsubps_avx(auVar60,auVar204);
  auVar154._0_4_ = auVar45._0_4_ + (fVar226 + auVar153._0_4_) * 0.33333334;
  auVar154._4_4_ = auVar45._4_4_ + (fVar148 + auVar153._4_4_) * 0.33333334;
  auVar154._8_4_ = auVar45._8_4_ + (fVar161 + auVar153._8_4_) * 0.33333334;
  auVar154._12_4_ = auVar45._12_4_ + (fVar162 + auVar153._12_4_) * 0.33333334;
  auVar170._0_4_ = auVar61._0_4_ * 0.33333334;
  auVar170._4_4_ = auVar61._4_4_ * 0.33333334;
  auVar170._8_4_ = auVar61._8_4_ * 0.33333334;
  auVar170._12_4_ = auVar61._12_4_ * 0.33333334;
  auVar44 = vsubps_avx(auVar54,auVar170);
  auVar259._4_4_ = fVar211;
  auVar259._0_4_ = fVar211;
  auVar259._8_4_ = fVar211;
  auVar259._12_4_ = fVar211;
  auVar61 = vsubss_avx512f(ZEXT416(0x3f800000),ZEXT416((uint)fVar211));
  auVar103._0_4_ = auVar61._0_4_;
  auVar103._4_4_ = auVar103._0_4_;
  auVar103._8_4_ = auVar103._0_4_;
  auVar103._12_4_ = auVar103._0_4_;
  auVar57 = vmulps_avx512vl(auVar259,auVar57);
  auVar61 = vmulps_avx512vl(auVar259,auVar213);
  auVar43 = vmulps_avx512vl(auVar259,auVar43);
  auVar268._0_4_ = fVar211 * auVar60._0_4_;
  auVar268._4_4_ = fVar211 * auVar60._4_4_;
  auVar268._8_4_ = fVar211 * auVar60._8_4_;
  auVar268._12_4_ = fVar211 * auVar60._12_4_;
  local_208 = vfmadd231ps_avx512vl(auVar57,auVar103,auVar51);
  local_218 = vfmadd231ps_avx512vl(auVar61,auVar103,auVar179);
  local_228 = vfmadd231ps_avx512vl(auVar43,auVar103,auVar58);
  local_238 = vfmadd231ps_fma(auVar268,auVar103,auVar46);
  auVar43 = vmulps_avx512vl(auVar259,auVar45);
  auVar45 = vmulps_avx512vl(auVar259,auVar154);
  auVar44 = vmulps_avx512vl(auVar259,auVar44);
  auVar249._0_4_ = fVar211 * auVar54._0_4_;
  auVar249._4_4_ = fVar211 * auVar54._4_4_;
  auVar249._8_4_ = fVar211 * auVar54._8_4_;
  auVar249._12_4_ = fVar211 * auVar54._12_4_;
  _local_248 = vfmadd231ps_avx512vl(auVar43,auVar103,auVar48);
  _local_258 = vfmadd231ps_avx512vl(auVar45,auVar103,_local_3d8);
  _local_268 = vfmadd231ps_avx512vl(auVar44,auVar103,auVar59);
  _local_278 = vfmadd231ps_fma(auVar249,auVar103,auVar52);
  auVar43 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar43 = vinsertps_avx(auVar43,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar100 = *(float *)(ray + k * 4 + 0x30);
  local_188 = vsubps_avx512vl(local_208,auVar43);
  uVar101 = local_188._0_4_;
  auVar108._4_4_ = uVar101;
  auVar108._0_4_ = uVar101;
  auVar108._8_4_ = uVar101;
  auVar108._12_4_ = uVar101;
  auVar44 = vshufps_avx(local_188,local_188,0x55);
  auVar45 = vshufps_avx(local_188,local_188,0xaa);
  aVar3 = pre->ray_space[k].vx.field_0;
  aVar4 = pre->ray_space[k].vy.field_0;
  fVar230 = pre->ray_space[k].vz.field_0.m128[0];
  fVar211 = pre->ray_space[k].vz.field_0.m128[1];
  fVar225 = pre->ray_space[k].vz.field_0.m128[2];
  fVar226 = pre->ray_space[k].vz.field_0.m128[3];
  auVar104._0_4_ = fVar230 * auVar45._0_4_;
  auVar104._4_4_ = fVar211 * auVar45._4_4_;
  auVar104._8_4_ = fVar225 * auVar45._8_4_;
  auVar104._12_4_ = fVar226 * auVar45._12_4_;
  auVar44 = vfmadd231ps_fma(auVar104,(undefined1  [16])aVar4,auVar44);
  auVar58 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar3,auVar108);
  local_198 = vsubps_avx512vl(local_218,auVar43);
  uVar101 = local_198._0_4_;
  auVar117._4_4_ = uVar101;
  auVar117._0_4_ = uVar101;
  auVar117._8_4_ = uVar101;
  auVar117._12_4_ = uVar101;
  auVar44 = vshufps_avx(local_198,local_198,0x55);
  auVar45 = vshufps_avx(local_198,local_198,0xaa);
  auVar109._0_4_ = fVar230 * auVar45._0_4_;
  auVar109._4_4_ = fVar211 * auVar45._4_4_;
  auVar109._8_4_ = fVar225 * auVar45._8_4_;
  auVar109._12_4_ = fVar226 * auVar45._12_4_;
  auVar44 = vfmadd231ps_fma(auVar109,(undefined1  [16])aVar4,auVar44);
  auVar59 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar3,auVar117);
  local_1a8 = vsubps_avx512vl(local_228,auVar43);
  uVar101 = local_1a8._0_4_;
  auVar171._4_4_ = uVar101;
  auVar171._0_4_ = uVar101;
  auVar171._8_4_ = uVar101;
  auVar171._12_4_ = uVar101;
  auVar44 = vshufps_avx(local_1a8,local_1a8,0x55);
  auVar45 = vshufps_avx(local_1a8,local_1a8,0xaa);
  auVar118._0_4_ = fVar230 * auVar45._0_4_;
  auVar118._4_4_ = fVar211 * auVar45._4_4_;
  auVar118._8_4_ = fVar225 * auVar45._8_4_;
  auVar118._12_4_ = fVar226 * auVar45._12_4_;
  auVar44 = vfmadd231ps_fma(auVar118,(undefined1  [16])aVar4,auVar44);
  auVar61 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar3,auVar171);
  local_1b8 = vsubps_avx(local_238,auVar43);
  uVar101 = local_1b8._0_4_;
  auVar193._4_4_ = uVar101;
  auVar193._0_4_ = uVar101;
  auVar193._8_4_ = uVar101;
  auVar193._12_4_ = uVar101;
  auVar44 = vshufps_avx(local_1b8,local_1b8,0x55);
  auVar45 = vshufps_avx(local_1b8,local_1b8,0xaa);
  auVar172._0_4_ = fVar230 * auVar45._0_4_;
  auVar172._4_4_ = fVar211 * auVar45._4_4_;
  auVar172._8_4_ = fVar225 * auVar45._8_4_;
  auVar172._12_4_ = fVar226 * auVar45._12_4_;
  auVar44 = vfmadd231ps_fma(auVar172,(undefined1  [16])aVar4,auVar44);
  auVar62 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar3,auVar193);
  local_1c8 = vsubps_avx512vl(_local_248,auVar43);
  uVar101 = local_1c8._0_4_;
  auVar194._4_4_ = uVar101;
  auVar194._0_4_ = uVar101;
  auVar194._8_4_ = uVar101;
  auVar194._12_4_ = uVar101;
  auVar44 = vshufps_avx(local_1c8,local_1c8,0x55);
  auVar45 = vshufps_avx(local_1c8,local_1c8,0xaa);
  auVar214._0_4_ = auVar45._0_4_ * fVar230;
  auVar214._4_4_ = auVar45._4_4_ * fVar211;
  auVar214._8_4_ = auVar45._8_4_ * fVar225;
  auVar214._12_4_ = auVar45._12_4_ * fVar226;
  auVar44 = vfmadd231ps_fma(auVar214,(undefined1  [16])aVar4,auVar44);
  auVar63 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar3,auVar194);
  local_1d8 = vsubps_avx512vl(_local_258,auVar43);
  uVar101 = local_1d8._0_4_;
  auVar195._4_4_ = uVar101;
  auVar195._0_4_ = uVar101;
  auVar195._8_4_ = uVar101;
  auVar195._12_4_ = uVar101;
  auVar44 = vshufps_avx(local_1d8,local_1d8,0x55);
  auVar45 = vshufps_avx(local_1d8,local_1d8,0xaa);
  auVar231._0_4_ = auVar45._0_4_ * fVar230;
  auVar231._4_4_ = auVar45._4_4_ * fVar211;
  auVar231._8_4_ = auVar45._8_4_ * fVar225;
  auVar231._12_4_ = auVar45._12_4_ * fVar226;
  auVar44 = vfmadd231ps_fma(auVar231,(undefined1  [16])aVar4,auVar44);
  auVar19 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar3,auVar195);
  local_1e8 = vsubps_avx512vl(_local_268,auVar43);
  uVar101 = local_1e8._0_4_;
  auVar196._4_4_ = uVar101;
  auVar196._0_4_ = uVar101;
  auVar196._8_4_ = uVar101;
  auVar196._12_4_ = uVar101;
  auVar44 = vshufps_avx(local_1e8,local_1e8,0x55);
  auVar45 = vshufps_avx(local_1e8,local_1e8,0xaa);
  auVar238._0_4_ = auVar45._0_4_ * fVar230;
  auVar238._4_4_ = auVar45._4_4_ * fVar211;
  auVar238._8_4_ = auVar45._8_4_ * fVar225;
  auVar238._12_4_ = auVar45._12_4_ * fVar226;
  auVar44 = vfmadd231ps_fma(auVar238,(undefined1  [16])aVar4,auVar44);
  auVar20 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar3,auVar196);
  local_1f8 = vsubps_avx(_local_278,auVar43);
  uVar101 = local_1f8._0_4_;
  auVar140._4_4_ = uVar101;
  auVar140._0_4_ = uVar101;
  auVar140._8_4_ = uVar101;
  auVar140._12_4_ = uVar101;
  auVar43 = vshufps_avx(local_1f8,local_1f8,0x55);
  auVar44 = vshufps_avx(local_1f8,local_1f8,0xaa);
  auVar180._0_4_ = auVar44._0_4_ * fVar230;
  auVar180._4_4_ = auVar44._4_4_ * fVar211;
  auVar180._8_4_ = auVar44._8_4_ * fVar225;
  auVar180._12_4_ = auVar44._12_4_ * fVar226;
  auVar43 = vfmadd231ps_fma(auVar180,(undefined1  [16])aVar4,auVar43);
  auVar21 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar3,auVar140);
  auVar45 = vmovlhps_avx(auVar58,auVar63);
  auVar54 = vmovlhps_avx(auVar59,auVar19);
  auVar60 = vmovlhps_avx(auVar61,auVar20);
  _local_358 = vmovlhps_avx512f(auVar62,auVar21);
  auVar44 = vminps_avx(auVar45,auVar54);
  auVar43 = vmaxps_avx(auVar45,auVar54);
  auVar57 = vminps_avx512vl(auVar60,_local_358);
  auVar44 = vminps_avx(auVar44,auVar57);
  auVar57 = vmaxps_avx512vl(auVar60,_local_358);
  auVar43 = vmaxps_avx(auVar43,auVar57);
  auVar57 = vshufpd_avx(auVar44,auVar44,3);
  auVar44 = vminps_avx(auVar44,auVar57);
  auVar57 = vshufpd_avx(auVar43,auVar43,3);
  auVar43 = vmaxps_avx(auVar43,auVar57);
  auVar44 = vandps_avx512vl(auVar44,auVar271._0_16_);
  auVar43 = vandps_avx512vl(auVar43,auVar271._0_16_);
  auVar43 = vmaxps_avx(auVar44,auVar43);
  auVar44 = vmovshdup_avx(auVar43);
  auVar43 = vmaxss_avx(auVar44,auVar43);
  fVar230 = auVar43._0_4_ * 9.536743e-07;
  local_318 = vmovddup_avx512vl(auVar58);
  local_328 = vmovddup_avx512vl(auVar59);
  local_338 = vmovddup_avx512vl(auVar61);
  local_348 = vmovddup_avx512vl(auVar62);
  local_368 = ZEXT416((uint)fVar230);
  auVar105._4_4_ = fVar230;
  auVar105._0_4_ = fVar230;
  auVar105._8_4_ = fVar230;
  auVar105._12_4_ = fVar230;
  local_78._16_4_ = fVar230;
  local_78._0_16_ = auVar105;
  local_78._20_4_ = fVar230;
  local_78._24_4_ = fVar230;
  local_78._28_4_ = fVar230;
  auVar22._8_4_ = 0x80000000;
  auVar22._0_8_ = 0x8000000080000000;
  auVar22._12_4_ = 0x80000000;
  auVar43 = vxorps_avx512vl(auVar105,auVar22);
  local_98 = auVar43._0_4_;
  uStack_94 = local_98;
  uStack_90 = local_98;
  uStack_8c = local_98;
  uStack_88 = local_98;
  uStack_84 = local_98;
  uStack_80 = local_98;
  uStack_7c = local_98;
  uVar34 = 0;
  local_158 = vsubps_avx(auVar54,auVar45);
  local_168 = vsubps_avx(auVar60,auVar54);
  local_178 = vsubps_avx512vl(_local_358,auVar60);
  local_288 = vsubps_avx512vl(_local_248,local_208);
  local_298 = vsubps_avx512vl(_local_258,local_218);
  local_2a8 = vsubps_avx512vl(_local_268,local_228);
  _local_2b8 = vsubps_avx(_local_278,local_238);
  local_2d8 = vpbroadcastd_avx512vl();
  local_2e8 = vpbroadcastd_avx512vl();
  auVar43 = ZEXT816(0x3f80000000000000);
  auVar246 = ZEXT1664(auVar43);
  do {
    auVar46 = auVar246._0_16_;
    auVar44 = vshufps_avx(auVar46,auVar46,0x50);
    auVar250._8_4_ = 0x3f800000;
    auVar250._0_8_ = &DAT_3f8000003f800000;
    auVar250._12_4_ = 0x3f800000;
    auVar255._16_4_ = 0x3f800000;
    auVar255._0_16_ = auVar250;
    auVar255._20_4_ = 0x3f800000;
    auVar255._24_4_ = 0x3f800000;
    auVar255._28_4_ = 0x3f800000;
    auVar57 = vsubps_avx(auVar250,auVar44);
    fVar230 = auVar44._0_4_;
    fVar256 = auVar63._0_4_;
    auVar126._0_4_ = fVar256 * fVar230;
    fVar211 = auVar44._4_4_;
    fVar265 = auVar63._4_4_;
    auVar126._4_4_ = fVar265 * fVar211;
    fVar225 = auVar44._8_4_;
    auVar126._8_4_ = fVar256 * fVar225;
    fVar226 = auVar44._12_4_;
    auVar126._12_4_ = fVar265 * fVar226;
    fVar266 = auVar19._0_4_;
    auVar141._0_4_ = fVar266 * fVar230;
    fVar269 = auVar19._4_4_;
    auVar141._4_4_ = fVar269 * fVar211;
    auVar141._8_4_ = fVar266 * fVar225;
    auVar141._12_4_ = fVar269 * fVar226;
    fVar148 = auVar20._0_4_;
    auVar155._0_4_ = fVar148 * fVar230;
    fVar161 = auVar20._4_4_;
    auVar155._4_4_ = fVar161 * fVar211;
    auVar155._8_4_ = fVar148 * fVar225;
    auVar155._12_4_ = fVar161 * fVar226;
    fVar162 = auVar21._0_4_;
    auVar110._0_4_ = fVar162 * fVar230;
    fVar177 = auVar21._4_4_;
    auVar110._4_4_ = fVar177 * fVar211;
    auVar110._8_4_ = fVar162 * fVar225;
    auVar110._12_4_ = fVar177 * fVar226;
    auVar58 = vfmadd231ps_avx512vl(auVar126,auVar57,local_318);
    auVar59 = vfmadd231ps_avx512vl(auVar141,auVar57,local_328);
    auVar61 = vfmadd231ps_avx512vl(auVar155,auVar57,local_338);
    auVar57 = vfmadd231ps_avx512vl(auVar110,local_348,auVar57);
    auVar44 = vmovshdup_avx(auVar43);
    fVar211 = auVar43._0_4_;
    fVar230 = (auVar44._0_4_ - fVar211) * 0.04761905;
    auVar131._4_4_ = fVar211;
    auVar131._0_4_ = fVar211;
    auVar131._8_4_ = fVar211;
    auVar131._12_4_ = fVar211;
    auVar131._16_4_ = fVar211;
    auVar131._20_4_ = fVar211;
    auVar131._24_4_ = fVar211;
    auVar131._28_4_ = fVar211;
    auVar78._0_8_ = auVar44._0_8_;
    auVar78._8_8_ = auVar78._0_8_;
    auVar78._16_8_ = auVar78._0_8_;
    auVar78._24_8_ = auVar78._0_8_;
    auVar85 = vsubps_avx(auVar78,auVar131);
    uVar101 = auVar58._0_4_;
    auVar87._4_4_ = uVar101;
    auVar87._0_4_ = uVar101;
    auVar87._8_4_ = uVar101;
    auVar87._12_4_ = uVar101;
    auVar87._16_4_ = uVar101;
    auVar87._20_4_ = uVar101;
    auVar87._24_4_ = uVar101;
    auVar87._28_4_ = uVar101;
    auVar208._8_4_ = 1;
    auVar208._0_8_ = 0x100000001;
    auVar208._12_4_ = 1;
    auVar208._16_4_ = 1;
    auVar208._20_4_ = 1;
    auVar208._24_4_ = 1;
    auVar208._28_4_ = 1;
    auVar83 = ZEXT1632(auVar58);
    auVar81 = vpermps_avx2(auVar208,auVar83);
    auVar67 = vbroadcastss_avx512vl(auVar59);
    auVar84 = ZEXT1632(auVar59);
    auVar68 = vpermps_avx512vl(auVar208,auVar84);
    auVar69 = vbroadcastss_avx512vl(auVar61);
    auVar82 = ZEXT1632(auVar61);
    auVar70 = vpermps_avx512vl(auVar208,auVar82);
    auVar71 = vbroadcastss_avx512vl(auVar57);
    auVar80 = ZEXT1632(auVar57);
    auVar72 = vpermps_avx512vl(auVar208,auVar80);
    auVar209._4_4_ = fVar230;
    auVar209._0_4_ = fVar230;
    auVar209._8_4_ = fVar230;
    auVar209._12_4_ = fVar230;
    auVar209._16_4_ = fVar230;
    auVar209._20_4_ = fVar230;
    auVar209._24_4_ = fVar230;
    auVar209._28_4_ = fVar230;
    auVar79._8_4_ = 2;
    auVar79._0_8_ = 0x200000002;
    auVar79._12_4_ = 2;
    auVar79._16_4_ = 2;
    auVar79._20_4_ = 2;
    auVar79._24_4_ = 2;
    auVar79._28_4_ = 2;
    auVar73 = vpermps_avx512vl(auVar79,auVar83);
    auVar74 = vbroadcastss_avx512vl(ZEXT416(3));
    auVar75 = vpermps_avx512vl(auVar74,auVar83);
    auVar83 = vpermps_avx2(auVar79,auVar84);
    auVar76 = vpermps_avx512vl(auVar74,auVar84);
    auVar84 = vpermps_avx2(auVar79,auVar82);
    auVar77 = vpermps_avx512vl(auVar74,auVar82);
    auVar78 = vpermps_avx512vl(auVar79,auVar80);
    auVar79 = vpermps_avx512vl(auVar74,auVar80);
    auVar44 = vfmadd132ps_fma(auVar85,auVar131,_DAT_02020f20);
    auVar85 = vsubps_avx(auVar255,ZEXT1632(auVar44));
    auVar74 = vmulps_avx512vl(auVar67,ZEXT1632(auVar44));
    auVar82 = ZEXT1632(auVar44);
    auVar80 = vmulps_avx512vl(auVar68,auVar82);
    auVar57 = vfmadd231ps_fma(auVar74,auVar85,auVar87);
    auVar58 = vfmadd231ps_fma(auVar80,auVar85,auVar81);
    auVar74 = vmulps_avx512vl(auVar69,auVar82);
    auVar80 = vmulps_avx512vl(auVar70,auVar82);
    auVar67 = vfmadd231ps_avx512vl(auVar74,auVar85,auVar67);
    auVar68 = vfmadd231ps_avx512vl(auVar80,auVar85,auVar68);
    auVar74 = vmulps_avx512vl(auVar71,auVar82);
    auVar87 = ZEXT1632(auVar44);
    auVar72 = vmulps_avx512vl(auVar72,auVar87);
    auVar69 = vfmadd231ps_avx512vl(auVar74,auVar85,auVar69);
    auVar70 = vfmadd231ps_avx512vl(auVar72,auVar85,auVar70);
    fVar225 = auVar44._0_4_;
    fVar226 = auVar44._4_4_;
    auVar72._4_4_ = fVar226 * auVar67._4_4_;
    auVar72._0_4_ = fVar225 * auVar67._0_4_;
    fVar227 = auVar44._8_4_;
    auVar72._8_4_ = fVar227 * auVar67._8_4_;
    fVar228 = auVar44._12_4_;
    auVar72._12_4_ = fVar228 * auVar67._12_4_;
    auVar72._16_4_ = auVar67._16_4_ * 0.0;
    auVar72._20_4_ = auVar67._20_4_ * 0.0;
    auVar72._24_4_ = auVar67._24_4_ * 0.0;
    auVar72._28_4_ = fVar211;
    auVar74._4_4_ = fVar226 * auVar68._4_4_;
    auVar74._0_4_ = fVar225 * auVar68._0_4_;
    auVar74._8_4_ = fVar227 * auVar68._8_4_;
    auVar74._12_4_ = fVar228 * auVar68._12_4_;
    auVar74._16_4_ = auVar68._16_4_ * 0.0;
    auVar74._20_4_ = auVar68._20_4_ * 0.0;
    auVar74._24_4_ = auVar68._24_4_ * 0.0;
    auVar74._28_4_ = auVar81._28_4_;
    auVar57 = vfmadd231ps_fma(auVar72,auVar85,ZEXT1632(auVar57));
    auVar58 = vfmadd231ps_fma(auVar74,auVar85,ZEXT1632(auVar58));
    auVar86._0_4_ = fVar225 * auVar69._0_4_;
    auVar86._4_4_ = fVar226 * auVar69._4_4_;
    auVar86._8_4_ = fVar227 * auVar69._8_4_;
    auVar86._12_4_ = fVar228 * auVar69._12_4_;
    auVar86._16_4_ = auVar69._16_4_ * 0.0;
    auVar86._20_4_ = auVar69._20_4_ * 0.0;
    auVar86._24_4_ = auVar69._24_4_ * 0.0;
    auVar86._28_4_ = 0;
    auVar80._4_4_ = fVar226 * auVar70._4_4_;
    auVar80._0_4_ = fVar225 * auVar70._0_4_;
    auVar80._8_4_ = fVar227 * auVar70._8_4_;
    auVar80._12_4_ = fVar228 * auVar70._12_4_;
    auVar80._16_4_ = auVar70._16_4_ * 0.0;
    auVar80._20_4_ = auVar70._20_4_ * 0.0;
    auVar80._24_4_ = auVar70._24_4_ * 0.0;
    auVar80._28_4_ = auVar69._28_4_;
    auVar59 = vfmadd231ps_fma(auVar86,auVar85,auVar67);
    auVar61 = vfmadd231ps_fma(auVar80,auVar85,auVar68);
    auVar82._28_4_ = auVar68._28_4_;
    auVar82._0_28_ =
         ZEXT1628(CONCAT412(fVar228 * auVar61._12_4_,
                            CONCAT48(fVar227 * auVar61._8_4_,
                                     CONCAT44(fVar226 * auVar61._4_4_,fVar225 * auVar61._0_4_))));
    auVar62 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar228 * auVar59._12_4_,
                                                 CONCAT48(fVar227 * auVar59._8_4_,
                                                          CONCAT44(fVar226 * auVar59._4_4_,
                                                                   fVar225 * auVar59._0_4_)))),
                              auVar85,ZEXT1632(auVar57));
    auVar64 = vfmadd231ps_fma(auVar82,auVar85,ZEXT1632(auVar58));
    auVar81 = vsubps_avx(ZEXT1632(auVar59),ZEXT1632(auVar57));
    auVar67 = vsubps_avx(ZEXT1632(auVar61),ZEXT1632(auVar58));
    auVar68 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar81 = vmulps_avx512vl(auVar81,auVar68);
    auVar67 = vmulps_avx512vl(auVar67,auVar68);
    auVar146._0_4_ = fVar230 * auVar81._0_4_;
    auVar146._4_4_ = fVar230 * auVar81._4_4_;
    auVar146._8_4_ = fVar230 * auVar81._8_4_;
    auVar146._12_4_ = fVar230 * auVar81._12_4_;
    auVar146._16_4_ = fVar230 * auVar81._16_4_;
    auVar146._20_4_ = fVar230 * auVar81._20_4_;
    auVar146._24_4_ = fVar230 * auVar81._24_4_;
    auVar146._28_4_ = 0;
    auVar81 = vmulps_avx512vl(auVar209,auVar67);
    auVar59 = vxorps_avx512vl(auVar71._0_16_,auVar71._0_16_);
    auVar67 = vpermt2ps_avx512vl(ZEXT1632(auVar62),_DAT_0205fd20,ZEXT1632(auVar59));
    auVar69 = vpermt2ps_avx512vl(ZEXT1632(auVar64),_DAT_0205fd20,ZEXT1632(auVar59));
    auVar116._0_4_ = auVar146._0_4_ + auVar62._0_4_;
    auVar116._4_4_ = auVar146._4_4_ + auVar62._4_4_;
    auVar116._8_4_ = auVar146._8_4_ + auVar62._8_4_;
    auVar116._12_4_ = auVar146._12_4_ + auVar62._12_4_;
    auVar116._16_4_ = auVar146._16_4_ + 0.0;
    auVar116._20_4_ = auVar146._20_4_ + 0.0;
    auVar116._24_4_ = auVar146._24_4_ + 0.0;
    auVar116._28_4_ = 0;
    auVar86 = ZEXT1632(auVar59);
    auVar70 = vpermt2ps_avx512vl(auVar146,_DAT_0205fd20,auVar86);
    auVar71 = vaddps_avx512vl(ZEXT1632(auVar64),auVar81);
    auVar72 = vpermt2ps_avx512vl(auVar81,_DAT_0205fd20,auVar86);
    auVar81 = vsubps_avx(auVar67,auVar70);
    auVar70 = vsubps_avx512vl(auVar69,auVar72);
    auVar72 = vmulps_avx512vl(auVar83,auVar87);
    auVar74 = vmulps_avx512vl(auVar76,auVar87);
    auVar72 = vfmadd231ps_avx512vl(auVar72,auVar85,auVar73);
    auVar74 = vfmadd231ps_avx512vl(auVar74,auVar85,auVar75);
    auVar80 = vmulps_avx512vl(auVar84,auVar87);
    auVar82 = vmulps_avx512vl(auVar77,auVar87);
    auVar83 = vfmadd231ps_avx512vl(auVar80,auVar85,auVar83);
    auVar80 = vfmadd231ps_avx512vl(auVar82,auVar85,auVar76);
    auVar82 = vmulps_avx512vl(auVar78,auVar87);
    auVar73 = vmulps_avx512vl(auVar79,auVar87);
    auVar57 = vfmadd231ps_fma(auVar82,auVar85,auVar84);
    auVar58 = vfmadd231ps_fma(auVar73,auVar85,auVar77);
    auVar82 = vmulps_avx512vl(auVar87,auVar83);
    auVar73 = vmulps_avx512vl(ZEXT1632(auVar44),auVar80);
    auVar72 = vfmadd231ps_avx512vl(auVar82,auVar85,auVar72);
    auVar74 = vfmadd231ps_avx512vl(auVar73,auVar85,auVar74);
    auVar83 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar228 * auVar57._12_4_,
                                            CONCAT48(fVar227 * auVar57._8_4_,
                                                     CONCAT44(fVar226 * auVar57._4_4_,
                                                              fVar225 * auVar57._0_4_)))),auVar85,
                         auVar83);
    auVar80 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar228 * auVar58._12_4_,
                                            CONCAT48(fVar227 * auVar58._8_4_,
                                                     CONCAT44(fVar226 * auVar58._4_4_,
                                                              fVar225 * auVar58._0_4_)))),auVar85,
                         auVar80);
    auVar73._4_4_ = fVar226 * auVar83._4_4_;
    auVar73._0_4_ = fVar225 * auVar83._0_4_;
    auVar73._8_4_ = fVar227 * auVar83._8_4_;
    auVar73._12_4_ = fVar228 * auVar83._12_4_;
    auVar73._16_4_ = auVar83._16_4_ * 0.0;
    auVar73._20_4_ = auVar83._20_4_ * 0.0;
    auVar73._24_4_ = auVar83._24_4_ * 0.0;
    auVar73._28_4_ = auVar77._28_4_;
    auVar75._4_4_ = fVar226 * auVar80._4_4_;
    auVar75._0_4_ = fVar225 * auVar80._0_4_;
    auVar75._8_4_ = fVar227 * auVar80._8_4_;
    auVar75._12_4_ = fVar228 * auVar80._12_4_;
    auVar75._16_4_ = auVar80._16_4_ * 0.0;
    auVar75._20_4_ = auVar80._20_4_ * 0.0;
    auVar75._24_4_ = auVar80._24_4_ * 0.0;
    auVar75._28_4_ = auVar84._28_4_;
    auVar84 = vfmadd231ps_avx512vl(auVar73,auVar85,auVar72);
    auVar82 = vfmadd231ps_avx512vl(auVar75,auVar74,auVar85);
    auVar85 = vsubps_avx512vl(auVar83,auVar72);
    auVar83 = vsubps_avx512vl(auVar80,auVar74);
    auVar85 = vmulps_avx512vl(auVar85,auVar68);
    auVar83 = vmulps_avx512vl(auVar83,auVar68);
    fVar211 = fVar230 * auVar85._0_4_;
    fVar225 = fVar230 * auVar85._4_4_;
    auVar76._4_4_ = fVar225;
    auVar76._0_4_ = fVar211;
    fVar226 = fVar230 * auVar85._8_4_;
    auVar76._8_4_ = fVar226;
    fVar227 = fVar230 * auVar85._12_4_;
    auVar76._12_4_ = fVar227;
    fVar228 = fVar230 * auVar85._16_4_;
    auVar76._16_4_ = fVar228;
    fVar229 = fVar230 * auVar85._20_4_;
    auVar76._20_4_ = fVar229;
    fVar230 = fVar230 * auVar85._24_4_;
    auVar76._24_4_ = fVar230;
    auVar76._28_4_ = auVar85._28_4_;
    auVar83 = vmulps_avx512vl(auVar209,auVar83);
    auVar68 = vpermt2ps_avx512vl(auVar84,_DAT_0205fd20,auVar86);
    auVar72 = vpermt2ps_avx512vl(auVar82,_DAT_0205fd20,auVar86);
    auVar210._0_4_ = auVar84._0_4_ + fVar211;
    auVar210._4_4_ = auVar84._4_4_ + fVar225;
    auVar210._8_4_ = auVar84._8_4_ + fVar226;
    auVar210._12_4_ = auVar84._12_4_ + fVar227;
    auVar210._16_4_ = auVar84._16_4_ + fVar228;
    auVar210._20_4_ = auVar84._20_4_ + fVar229;
    auVar210._24_4_ = auVar84._24_4_ + fVar230;
    auVar210._28_4_ = auVar84._28_4_ + auVar85._28_4_;
    auVar85 = vpermt2ps_avx512vl(auVar76,_DAT_0205fd20,ZEXT1632(auVar59));
    auVar74 = vaddps_avx512vl(auVar82,auVar83);
    auVar83 = vpermt2ps_avx512vl(auVar83,_DAT_0205fd20,ZEXT1632(auVar59));
    auVar85 = vsubps_avx(auVar68,auVar85);
    auVar83 = vsubps_avx512vl(auVar72,auVar83);
    auVar131 = ZEXT1632(auVar62);
    auVar80 = vsubps_avx512vl(auVar84,auVar131);
    auVar146 = ZEXT1632(auVar64);
    auVar73 = vsubps_avx512vl(auVar82,auVar146);
    auVar75 = vsubps_avx512vl(auVar68,auVar67);
    auVar80 = vaddps_avx512vl(auVar80,auVar75);
    auVar75 = vsubps_avx512vl(auVar72,auVar69);
    auVar73 = vaddps_avx512vl(auVar73,auVar75);
    auVar75 = vmulps_avx512vl(auVar146,auVar80);
    auVar75 = vfnmadd231ps_avx512vl(auVar75,auVar131,auVar73);
    auVar76 = vmulps_avx512vl(auVar71,auVar80);
    auVar76 = vfnmadd231ps_avx512vl(auVar76,auVar116,auVar73);
    auVar77 = vmulps_avx512vl(auVar70,auVar80);
    auVar77 = vfnmadd231ps_avx512vl(auVar77,auVar81,auVar73);
    auVar78 = vmulps_avx512vl(auVar69,auVar80);
    auVar78 = vfnmadd231ps_avx512vl(auVar78,auVar67,auVar73);
    auVar79 = vmulps_avx512vl(auVar82,auVar80);
    auVar79 = vfnmadd231ps_avx512vl(auVar79,auVar84,auVar73);
    auVar86 = vmulps_avx512vl(auVar74,auVar80);
    auVar86 = vfnmadd231ps_avx512vl(auVar86,auVar210,auVar73);
    auVar87 = vmulps_avx512vl(auVar83,auVar80);
    auVar87 = vfnmadd231ps_avx512vl(auVar87,auVar85,auVar73);
    auVar80 = vmulps_avx512vl(auVar72,auVar80);
    auVar80 = vfnmadd231ps_avx512vl(auVar80,auVar68,auVar73);
    auVar73 = vminps_avx512vl(auVar75,auVar76);
    auVar75 = vmaxps_avx512vl(auVar75,auVar76);
    auVar76 = vminps_avx512vl(auVar77,auVar78);
    auVar73 = vminps_avx512vl(auVar73,auVar76);
    auVar76 = vmaxps_avx512vl(auVar77,auVar78);
    auVar75 = vmaxps_avx512vl(auVar75,auVar76);
    auVar76 = vminps_avx512vl(auVar79,auVar86);
    auVar77 = vmaxps_avx512vl(auVar79,auVar86);
    auVar78 = vminps_avx512vl(auVar87,auVar80);
    auVar76 = vminps_avx512vl(auVar76,auVar78);
    auVar73 = vminps_avx512vl(auVar73,auVar76);
    auVar80 = vmaxps_avx512vl(auVar87,auVar80);
    auVar80 = vmaxps_avx512vl(auVar77,auVar80);
    auVar80 = vmaxps_avx512vl(auVar75,auVar80);
    uVar17 = vcmpps_avx512vl(auVar73,local_78,2);
    auVar77._4_4_ = uStack_94;
    auVar77._0_4_ = local_98;
    auVar77._8_4_ = uStack_90;
    auVar77._12_4_ = uStack_8c;
    auVar77._16_4_ = uStack_88;
    auVar77._20_4_ = uStack_84;
    auVar77._24_4_ = uStack_80;
    auVar77._28_4_ = uStack_7c;
    uVar18 = vcmpps_avx512vl(auVar80,auVar77,5);
    uVar40 = 0;
    bVar31 = (byte)uVar17 & (byte)uVar18 & 0x7f;
    if (bVar31 != 0) {
      auVar80 = vsubps_avx512vl(auVar67,auVar131);
      auVar73 = vsubps_avx512vl(auVar69,auVar146);
      auVar75 = vsubps_avx512vl(auVar68,auVar84);
      auVar80 = vaddps_avx512vl(auVar80,auVar75);
      auVar75 = vsubps_avx512vl(auVar72,auVar82);
      auVar73 = vaddps_avx512vl(auVar73,auVar75);
      auVar75 = vmulps_avx512vl(auVar146,auVar80);
      auVar75 = vfnmadd231ps_avx512vl(auVar75,auVar73,auVar131);
      auVar71 = vmulps_avx512vl(auVar71,auVar80);
      auVar71 = vfnmadd213ps_avx512vl(auVar116,auVar73,auVar71);
      auVar70 = vmulps_avx512vl(auVar70,auVar80);
      auVar70 = vfnmadd213ps_avx512vl(auVar81,auVar73,auVar70);
      auVar81 = vmulps_avx512vl(auVar69,auVar80);
      auVar69 = vfnmadd231ps_avx512vl(auVar81,auVar73,auVar67);
      auVar81 = vmulps_avx512vl(auVar82,auVar80);
      auVar84 = vfnmadd231ps_avx512vl(auVar81,auVar73,auVar84);
      auVar81 = vmulps_avx512vl(auVar74,auVar80);
      auVar74 = vfnmadd213ps_avx512vl(auVar210,auVar73,auVar81);
      auVar81 = vmulps_avx512vl(auVar83,auVar80);
      auVar82 = vfnmadd213ps_avx512vl(auVar85,auVar73,auVar81);
      auVar85 = vmulps_avx512vl(auVar72,auVar80);
      auVar68 = vfnmadd231ps_avx512vl(auVar85,auVar68,auVar73);
      auVar81 = vminps_avx(auVar75,auVar71);
      auVar85 = vmaxps_avx(auVar75,auVar71);
      auVar67 = vminps_avx(auVar70,auVar69);
      auVar67 = vminps_avx(auVar81,auVar67);
      auVar81 = vmaxps_avx(auVar70,auVar69);
      auVar85 = vmaxps_avx(auVar85,auVar81);
      auVar83 = vminps_avx(auVar84,auVar74);
      auVar81 = vmaxps_avx(auVar84,auVar74);
      auVar84 = vminps_avx(auVar82,auVar68);
      auVar83 = vminps_avx(auVar83,auVar84);
      auVar83 = vminps_avx(auVar67,auVar83);
      auVar67 = vmaxps_avx(auVar82,auVar68);
      auVar81 = vmaxps_avx(auVar81,auVar67);
      auVar85 = vmaxps_avx(auVar85,auVar81);
      uVar17 = vcmpps_avx512vl(auVar85,auVar77,5);
      uVar18 = vcmpps_avx512vl(auVar83,local_78,2);
      uVar40 = (uint)(bVar31 & (byte)uVar17 & (byte)uVar18);
    }
    if (uVar40 != 0) {
      auStack_308[uVar34] = uVar40;
      uVar17 = vmovlps_avx(auVar43);
      *(undefined8 *)(&uStack_148 + uVar34 * 2) = uVar17;
      uVar42 = vmovlps_avx(auVar46);
      auStack_58[uVar34] = uVar42;
      uVar34 = (ulong)((int)uVar34 + 1);
    }
    auVar85 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar270 = ZEXT3264(auVar85);
    in_ZMM23 = ZEXT464(0x38d1b717);
    do {
      auVar57 = auVar275._0_16_;
      auVar43 = SUB6416(ZEXT464(0xb8d1b717),0);
      auVar44 = SUB6416(ZEXT464(0x38d1b717),0);
      if ((int)uVar34 == 0) {
        uVar101 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar27._4_4_ = uVar101;
        auVar27._0_4_ = uVar101;
        auVar27._8_4_ = uVar101;
        auVar27._12_4_ = uVar101;
        uVar17 = vcmpps_avx512vl(local_2c8,auVar27,2);
        uVar38 = (uint)uVar41 & (uint)uVar41 + 0xf & (uint)uVar17;
        uVar41 = (ulong)uVar38;
        if (uVar38 == 0) {
          return;
        }
        goto LAB_01c5978e;
      }
      uVar32 = (int)uVar34 - 1;
      uVar35 = (ulong)uVar32;
      uVar40 = (&uStack_148)[uVar35 * 2];
      fVar230 = afStack_144[uVar35 * 2];
      uVar6 = auStack_308[uVar35];
      auVar239._8_8_ = 0;
      auVar239._0_8_ = auStack_58[uVar35];
      auVar246 = ZEXT1664(auVar239);
      lVar37 = 0;
      for (uVar42 = (ulong)uVar6; (uVar42 & 1) == 0; uVar42 = uVar42 >> 1 | 0x8000000000000000) {
        lVar37 = lVar37 + 1;
      }
      uVar39 = uVar6 - 1 & uVar6;
      auStack_308[uVar35] = uVar39;
      if (uVar39 == 0) {
        uVar34 = (ulong)uVar32;
      }
      auVar62 = auVar273._0_16_;
      auVar58 = vcvtsi2ss_avx512f(auVar62,lVar37);
      auVar59 = vmulss_avx512f(auVar58,SUB6416(ZEXT464(0x3e124925),0));
      lVar37 = lVar37 + 1;
      auVar58 = vcvtsi2ss_avx512f(auVar62,lVar37);
      auVar58 = vmulss_avx512f(auVar58,SUB6416(ZEXT464(0x3e124925),0));
      auVar61 = vsubss_avx512f(auVar62,auVar59);
      auVar59 = vmulss_avx512f(ZEXT416((uint)fVar230),auVar59);
      auVar59 = vfmadd231ss_avx512f(auVar59,ZEXT416(uVar40),auVar61);
      auVar61 = vsubss_avx512f(auVar62,auVar58);
      auVar58 = vfmadd231ss_fma(ZEXT416((uint)(fVar230 * auVar58._0_4_)),ZEXT416(uVar40),auVar61);
      auVar61 = vsubss_avx512f(auVar58,auVar59);
      vucomiss_avx512f(auVar61);
      if (uVar6 == 0 || lVar37 == 0) break;
      auVar64 = vshufps_avx(auVar239,auVar239,0x50);
      vucomiss_avx512f(auVar61);
      uVar40 = (uint)uVar34;
      auVar137 = auVar272._0_16_;
      auVar48 = vsubps_avx512vl(auVar137,auVar64);
      fVar230 = auVar64._0_4_;
      auVar127._0_4_ = fVar256 * fVar230;
      fVar211 = auVar64._4_4_;
      auVar127._4_4_ = fVar265 * fVar211;
      fVar225 = auVar64._8_4_;
      auVar127._8_4_ = fVar256 * fVar225;
      fVar226 = auVar64._12_4_;
      auVar127._12_4_ = fVar265 * fVar226;
      auVar142._0_4_ = fVar266 * fVar230;
      auVar142._4_4_ = fVar269 * fVar211;
      auVar142._8_4_ = fVar266 * fVar225;
      auVar142._12_4_ = fVar269 * fVar226;
      auVar156._0_4_ = fVar148 * fVar230;
      auVar156._4_4_ = fVar161 * fVar211;
      auVar156._8_4_ = fVar148 * fVar225;
      auVar156._12_4_ = fVar161 * fVar226;
      auVar111._0_4_ = fVar162 * fVar230;
      auVar111._4_4_ = fVar177 * fVar211;
      auVar111._8_4_ = fVar162 * fVar225;
      auVar111._12_4_ = fVar177 * fVar226;
      auVar64 = vfmadd231ps_fma(auVar127,auVar48,local_318);
      auVar46 = vfmadd231ps_fma(auVar142,auVar48,local_328);
      auVar47 = vfmadd231ps_fma(auVar156,auVar48,local_338);
      auVar48 = vfmadd231ps_fma(auVar111,auVar48,local_348);
      auVar123._16_16_ = auVar64;
      auVar123._0_16_ = auVar64;
      auVar132._16_16_ = auVar46;
      auVar132._0_16_ = auVar46;
      auVar147._16_16_ = auVar47;
      auVar147._0_16_ = auVar47;
      uVar101 = auVar59._0_4_;
      auVar176._4_4_ = uVar101;
      auVar176._0_4_ = uVar101;
      auVar176._8_4_ = uVar101;
      auVar176._12_4_ = uVar101;
      uVar101 = auVar58._0_4_;
      auVar176._20_4_ = uVar101;
      auVar176._16_4_ = uVar101;
      auVar176._24_4_ = uVar101;
      auVar176._28_4_ = uVar101;
      auVar85 = vsubps_avx(auVar132,auVar123);
      auVar46 = vfmadd213ps_fma(auVar85,auVar176,auVar123);
      auVar85 = vsubps_avx(auVar147,auVar132);
      auVar49 = vfmadd213ps_fma(auVar85,auVar176,auVar132);
      auVar64 = vsubps_avx(auVar48,auVar47);
      auVar133._16_16_ = auVar64;
      auVar133._0_16_ = auVar64;
      auVar64 = vfmadd213ps_fma(auVar133,auVar176,auVar147);
      auVar85 = vsubps_avx(ZEXT1632(auVar49),ZEXT1632(auVar46));
      auVar46 = vfmadd213ps_fma(auVar85,auVar176,ZEXT1632(auVar46));
      auVar85 = vsubps_avx(ZEXT1632(auVar64),ZEXT1632(auVar49));
      auVar64 = vfmadd213ps_fma(auVar85,auVar176,ZEXT1632(auVar49));
      auVar85 = vsubps_avx(ZEXT1632(auVar64),ZEXT1632(auVar46));
      auVar125 = vfmadd231ps_fma(ZEXT1632(auVar46),auVar85,auVar176);
      auVar85 = vmulps_avx512vl(auVar85,auVar270._0_32_);
      auVar64 = vmulss_avx512f(auVar61,SUB6416(ZEXT464(0x3eaaaaab),0));
      fVar230 = auVar64._0_4_;
      auVar157._0_8_ =
           CONCAT44(auVar125._4_4_ + fVar230 * auVar85._4_4_,
                    auVar125._0_4_ + fVar230 * auVar85._0_4_);
      auVar157._8_4_ = auVar125._8_4_ + fVar230 * auVar85._8_4_;
      auVar157._12_4_ = auVar125._12_4_ + fVar230 * auVar85._12_4_;
      auVar128._0_4_ = fVar230 * auVar85._16_4_;
      auVar128._4_4_ = fVar230 * auVar85._20_4_;
      auVar128._8_4_ = fVar230 * auVar85._24_4_;
      auVar128._12_4_ = fVar230 * auVar85._28_4_;
      auVar65 = vsubps_avx((undefined1  [16])0x0,auVar128);
      auVar51 = vshufpd_avx(auVar125,auVar125,3);
      auVar52 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar64 = vsubps_avx(auVar51,auVar125);
      auVar46 = vsubps_avx(auVar52,(undefined1  [16])0x0);
      auVar181._0_4_ = auVar46._0_4_ + auVar64._0_4_;
      auVar181._4_4_ = auVar46._4_4_ + auVar64._4_4_;
      auVar181._8_4_ = auVar46._8_4_ + auVar64._8_4_;
      auVar181._12_4_ = auVar46._12_4_ + auVar64._12_4_;
      auVar64 = vshufps_avx(auVar125,auVar125,0xb1);
      auVar46 = vshufps_avx(auVar157,auVar157,0xb1);
      auVar47 = vshufps_avx(auVar65,auVar65,0xb1);
      auVar48 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar240._4_4_ = auVar181._0_4_;
      auVar240._0_4_ = auVar181._0_4_;
      auVar240._8_4_ = auVar181._0_4_;
      auVar240._12_4_ = auVar181._0_4_;
      auVar49 = vshufps_avx(auVar181,auVar181,0x55);
      fVar230 = auVar49._0_4_;
      auVar197._0_4_ = auVar64._0_4_ * fVar230;
      fVar211 = auVar49._4_4_;
      auVar197._4_4_ = auVar64._4_4_ * fVar211;
      fVar225 = auVar49._8_4_;
      auVar197._8_4_ = auVar64._8_4_ * fVar225;
      fVar226 = auVar49._12_4_;
      auVar197._12_4_ = auVar64._12_4_ * fVar226;
      auVar205._0_4_ = auVar46._0_4_ * fVar230;
      auVar205._4_4_ = auVar46._4_4_ * fVar211;
      auVar205._8_4_ = auVar46._8_4_ * fVar225;
      auVar205._12_4_ = auVar46._12_4_ * fVar226;
      auVar215._0_4_ = auVar47._0_4_ * fVar230;
      auVar215._4_4_ = auVar47._4_4_ * fVar211;
      auVar215._8_4_ = auVar47._8_4_ * fVar225;
      auVar215._12_4_ = auVar47._12_4_ * fVar226;
      auVar182._0_4_ = auVar48._0_4_ * fVar230;
      auVar182._4_4_ = auVar48._4_4_ * fVar211;
      auVar182._8_4_ = auVar48._8_4_ * fVar225;
      auVar182._12_4_ = auVar48._12_4_ * fVar226;
      auVar64 = vfmadd231ps_fma(auVar197,auVar240,auVar125);
      auVar46 = vfmadd231ps_fma(auVar205,auVar240,auVar157);
      auVar49 = vfmadd231ps_fma(auVar215,auVar240,auVar65);
      auVar66 = vfmadd231ps_fma(auVar182,(undefined1  [16])0x0,auVar240);
      auVar50 = vshufpd_avx(auVar64,auVar64,1);
      auVar53 = vshufpd_avx(auVar46,auVar46,1);
      auVar55 = vshufpd_avx(auVar49,auVar49,1);
      auVar56 = vshufpd_avx(auVar66,auVar66,1);
      auVar47 = vminss_avx(auVar64,auVar46);
      auVar64 = vmaxss_avx(auVar46,auVar64);
      auVar48 = vminss_avx(auVar49,auVar66);
      auVar46 = vmaxss_avx(auVar66,auVar49);
      auVar48 = vminss_avx(auVar47,auVar48);
      auVar64 = vmaxss_avx(auVar46,auVar64);
      auVar49 = vminss_avx(auVar50,auVar53);
      auVar46 = vmaxss_avx(auVar53,auVar50);
      auVar50 = vminss_avx(auVar55,auVar56);
      auVar47 = vmaxss_avx(auVar56,auVar55);
      auVar49 = vminss_avx(auVar49,auVar50);
      auVar46 = vmaxss_avx(auVar47,auVar46);
      auVar47 = vucomiss_avx512f(auVar48);
      in_ZMM23 = ZEXT1664(auVar47);
      if ((uVar40 < 5) || (auVar46 = vucomiss_avx512f(auVar43), uVar40 < 5)) {
        auVar64 = vucomiss_avx512f(auVar43);
        uVar17 = vcmpps_avx512vl(auVar49,auVar44,1);
        uVar18 = vcmpps_avx512vl(auVar48,auVar44,1);
        if ((4 < uVar40 & ((byte)uVar18 | (byte)uVar17)) != 0) goto LAB_01c5aab0;
        uVar17 = vcmpps_avx512vl(auVar43,auVar46,5);
        uVar18 = vcmpps_avx512vl(auVar49,auVar44,5);
        if ((((ushort)uVar18 | (ushort)uVar17) & 1) == 0) goto LAB_01c5aab0;
LAB_01c5b4c8:
        bVar13 = true;
        auVar246 = ZEXT1664(auVar239);
      }
      else {
LAB_01c5aab0:
        uVar17 = vcmpss_avx512f(auVar48,auVar57,1);
        bVar13 = (bool)((byte)uVar17 & 1);
        iVar99 = auVar273._0_4_;
        fVar230 = (float)((uint)bVar13 * -0x40800000 + (uint)!bVar13 * iVar99);
        uVar17 = vcmpss_avx512f(auVar64,auVar57,1);
        bVar13 = (bool)((byte)uVar17 & 1);
        fVar211 = (float)((uint)bVar13 * -0x40800000 + (uint)!bVar13 * iVar99);
        bVar13 = fVar230 != fVar211;
        iVar274 = auVar275._0_4_;
        auVar85._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar88._4_28_ = auVar85._4_28_;
        auVar88._0_4_ = (uint)bVar13 * iVar274 + (uint)!bVar13 * 0x7f800000;
        auVar44 = auVar88._0_16_;
        auVar90._16_16_ = auVar85._16_16_;
        auVar90._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar89._4_28_ = auVar90._4_28_;
        auVar89._0_4_ = (uint)bVar13 * iVar274 + (uint)!bVar13 * -0x800000;
        auVar43 = auVar89._0_16_;
        uVar17 = vcmpss_avx512f(auVar49,auVar57,1);
        bVar13 = (bool)((byte)uVar17 & 1);
        fVar225 = (float)((uint)bVar13 * -0x40800000 + (uint)!bVar13 * iVar99);
        if ((fVar230 != fVar225) || (NAN(fVar230) || NAN(fVar225))) {
          fVar226 = auVar49._0_4_;
          fVar230 = auVar48._0_4_;
          bVar13 = fVar226 == fVar230;
          if ((!bVar13) || (NAN(fVar226) || NAN(fVar230))) {
            auVar26._8_4_ = 0x80000000;
            auVar26._0_8_ = 0x8000000080000000;
            auVar26._12_4_ = 0x80000000;
            auVar47 = vxorps_avx512vl(auVar48,auVar26);
            auVar260._0_4_ = auVar47._0_4_ / (fVar226 - fVar230);
            auVar260._4_12_ = auVar47._4_12_;
            auVar47 = vsubss_avx512f(auVar62,auVar260);
            auVar48 = vfmadd213ss_avx512f(auVar47,auVar57,auVar260);
            auVar47 = auVar48;
          }
          else {
            vucomiss_avx512f(auVar57);
            auVar92._16_16_ = auVar85._16_16_;
            auVar92._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar91._4_28_ = auVar92._4_28_;
            auVar91._0_4_ = (uint)bVar13 * iVar274 + (uint)!bVar13 * 0x7f800000;
            auVar48 = auVar91._0_16_;
            auVar47 = ZEXT416((uint)bVar13 * 0x3f800000 + (uint)!bVar13 * -0x800000);
          }
          auVar44 = vminss_avx(auVar44,auVar48);
          auVar43 = vmaxss_avx(auVar47,auVar43);
        }
        uVar17 = vcmpss_avx512f(auVar46,auVar57,1);
        bVar13 = (bool)((byte)uVar17 & 1);
        fVar230 = (float)((uint)bVar13 * -0x40800000 + (uint)!bVar13 * iVar99);
        if ((fVar211 != fVar230) || (NAN(fVar211) || NAN(fVar230))) {
          fVar226 = auVar46._0_4_;
          fVar211 = auVar64._0_4_;
          bVar13 = fVar226 == fVar211;
          if ((!bVar13) || (NAN(fVar226) || NAN(fVar211))) {
            auVar25._8_4_ = 0x80000000;
            auVar25._0_8_ = 0x8000000080000000;
            auVar25._12_4_ = 0x80000000;
            auVar64 = vxorps_avx512vl(auVar64,auVar25);
            auVar216._0_4_ = auVar64._0_4_ / (fVar226 - fVar211);
            auVar216._4_12_ = auVar64._4_12_;
            auVar64 = vsubss_avx512f(auVar62,auVar216);
            auVar46 = vfmadd213ss_avx512f(auVar64,auVar57,auVar216);
            auVar64 = auVar46;
          }
          else {
            vucomiss_avx512f(auVar57);
            auVar94._16_16_ = auVar85._16_16_;
            auVar94._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar93._4_28_ = auVar94._4_28_;
            auVar93._0_4_ = (uint)bVar13 * iVar274 + (uint)!bVar13 * 0x7f800000;
            auVar46 = auVar93._0_16_;
            auVar64 = ZEXT416((uint)bVar13 * 0x3f800000 + (uint)!bVar13 * -0x800000);
          }
          auVar44 = vminss_avx(auVar44,auVar46);
          auVar43 = vmaxss_avx(auVar64,auVar43);
        }
        bVar13 = fVar225 != fVar230;
        auVar64 = vminss_avx512f(auVar44,auVar62);
        auVar96._16_16_ = auVar85._16_16_;
        auVar96._0_16_ = auVar44;
        auVar95._4_28_ = auVar96._4_28_;
        auVar95._0_4_ = (uint)bVar13 * auVar64._0_4_ + (uint)!bVar13 * auVar44._0_4_;
        auVar44 = vmaxss_avx512f(auVar62,auVar43);
        auVar98._16_16_ = auVar85._16_16_;
        auVar98._0_16_ = auVar43;
        auVar97._4_28_ = auVar98._4_28_;
        auVar97._0_4_ = (uint)bVar13 * auVar44._0_4_ + (uint)!bVar13 * auVar43._0_4_;
        auVar43 = vmaxss_avx512f(auVar57,auVar95._0_16_);
        auVar44 = vminss_avx512f(auVar97._0_16_,auVar62);
        bVar13 = true;
        if (auVar44._0_4_ < auVar43._0_4_) goto LAB_01c5b4c8;
        auVar50 = vmaxss_avx512f(auVar57,ZEXT416((uint)(auVar43._0_4_ + -0.1)));
        auVar53 = vminss_avx512f(ZEXT416((uint)(auVar44._0_4_ + 0.1)),auVar62);
        auVar112._0_8_ = auVar125._0_8_;
        auVar112._8_8_ = auVar112._0_8_;
        auVar206._8_8_ = auVar157._0_8_;
        auVar206._0_8_ = auVar157._0_8_;
        auVar217._8_8_ = auVar65._0_8_;
        auVar217._0_8_ = auVar65._0_8_;
        auVar43 = vshufpd_avx(auVar157,auVar157,3);
        auVar44 = vshufpd_avx(auVar65,auVar65,3);
        auVar64 = vshufps_avx(auVar50,auVar53,0);
        auVar49 = vsubps_avx512vl(auVar137,auVar64);
        fVar230 = auVar64._0_4_;
        auVar251._0_4_ = fVar230 * auVar51._0_4_;
        fVar211 = auVar64._4_4_;
        auVar251._4_4_ = fVar211 * auVar51._4_4_;
        fVar225 = auVar64._8_4_;
        auVar251._8_4_ = fVar225 * auVar51._8_4_;
        fVar226 = auVar64._12_4_;
        auVar251._12_4_ = fVar226 * auVar51._12_4_;
        auVar158._0_4_ = fVar230 * auVar43._0_4_;
        auVar158._4_4_ = fVar211 * auVar43._4_4_;
        auVar158._8_4_ = fVar225 * auVar43._8_4_;
        auVar158._12_4_ = fVar226 * auVar43._12_4_;
        auVar173._0_4_ = fVar230 * auVar44._0_4_;
        auVar173._4_4_ = fVar211 * auVar44._4_4_;
        auVar173._8_4_ = fVar225 * auVar44._8_4_;
        auVar173._12_4_ = fVar226 * auVar44._12_4_;
        auVar129._0_4_ = fVar230 * auVar52._0_4_;
        auVar129._4_4_ = fVar211 * auVar52._4_4_;
        auVar129._8_4_ = fVar225 * auVar52._8_4_;
        auVar129._12_4_ = fVar226 * auVar52._12_4_;
        auVar46 = vfmadd231ps_fma(auVar251,auVar49,auVar112);
        auVar47 = vfmadd231ps_fma(auVar158,auVar49,auVar206);
        auVar48 = vfmadd231ps_fma(auVar173,auVar49,auVar217);
        auVar49 = vfmadd231ps_fma(auVar129,auVar49,ZEXT816(0));
        auVar43 = vsubss_avx512f(auVar62,auVar50);
        auVar44 = vmovshdup_avx512vl(auVar239);
        auVar56 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar44._0_4_ * auVar50._0_4_)),auVar239,
                                      auVar43);
        auVar43 = vsubss_avx512f(auVar62,auVar53);
        auVar65 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar53._0_4_ * auVar44._0_4_)),auVar239,
                                      auVar43);
        auVar50 = vdivss_avx512f(auVar62,auVar61);
        auVar43 = vsubps_avx(auVar47,auVar46);
        auVar119._0_4_ = auVar43._0_4_ * 3.0;
        auVar119._4_4_ = auVar43._4_4_ * 3.0;
        auVar119._8_4_ = auVar43._8_4_ * 3.0;
        auVar119._12_4_ = auVar43._12_4_ * 3.0;
        auVar43 = vsubps_avx(auVar48,auVar47);
        auVar183._0_4_ = auVar43._0_4_ * 3.0;
        auVar183._4_4_ = auVar43._4_4_ * 3.0;
        auVar183._8_4_ = auVar43._8_4_ * 3.0;
        auVar183._12_4_ = auVar43._12_4_ * 3.0;
        auVar43 = vsubps_avx(auVar49,auVar48);
        auVar198._0_4_ = auVar43._0_4_ * 3.0;
        auVar198._4_4_ = auVar43._4_4_ * 3.0;
        auVar198._8_4_ = auVar43._8_4_ * 3.0;
        auVar198._12_4_ = auVar43._12_4_ * 3.0;
        auVar44 = vminps_avx(auVar183,auVar198);
        auVar43 = vmaxps_avx(auVar183,auVar198);
        auVar44 = vminps_avx(auVar119,auVar44);
        auVar43 = vmaxps_avx(auVar119,auVar43);
        auVar61 = vshufpd_avx(auVar44,auVar44,3);
        auVar64 = vshufpd_avx(auVar43,auVar43,3);
        auVar44 = vminps_avx(auVar44,auVar61);
        auVar43 = vmaxps_avx(auVar43,auVar64);
        fVar230 = auVar50._0_4_;
        auVar199._0_4_ = fVar230 * auVar44._0_4_;
        auVar199._4_4_ = fVar230 * auVar44._4_4_;
        auVar199._8_4_ = fVar230 * auVar44._8_4_;
        auVar199._12_4_ = fVar230 * auVar44._12_4_;
        auVar184._0_4_ = fVar230 * auVar43._0_4_;
        auVar184._4_4_ = fVar230 * auVar43._4_4_;
        auVar184._8_4_ = fVar230 * auVar43._8_4_;
        auVar184._12_4_ = fVar230 * auVar43._12_4_;
        auVar50 = vdivss_avx512f(auVar62,ZEXT416((uint)(auVar65._0_4_ - auVar56._0_4_)));
        auVar43 = vshufpd_avx(auVar46,auVar46,3);
        auVar44 = vshufpd_avx(auVar47,auVar47,3);
        auVar61 = vshufpd_avx(auVar48,auVar48,3);
        auVar64 = vshufpd_avx(auVar49,auVar49,3);
        auVar43 = vsubps_avx(auVar43,auVar46);
        auVar46 = vsubps_avx(auVar44,auVar47);
        auVar47 = vsubps_avx(auVar61,auVar48);
        auVar64 = vsubps_avx(auVar64,auVar49);
        auVar44 = vminps_avx(auVar43,auVar46);
        auVar43 = vmaxps_avx(auVar43,auVar46);
        auVar61 = vminps_avx(auVar47,auVar64);
        auVar61 = vminps_avx(auVar44,auVar61);
        auVar44 = vmaxps_avx(auVar47,auVar64);
        auVar43 = vmaxps_avx(auVar43,auVar44);
        fVar230 = auVar50._0_4_;
        auVar218._0_4_ = fVar230 * auVar61._0_4_;
        auVar218._4_4_ = fVar230 * auVar61._4_4_;
        auVar218._8_4_ = fVar230 * auVar61._8_4_;
        auVar218._12_4_ = fVar230 * auVar61._12_4_;
        auVar232._0_4_ = fVar230 * auVar43._0_4_;
        auVar232._4_4_ = fVar230 * auVar43._4_4_;
        auVar232._8_4_ = fVar230 * auVar43._8_4_;
        auVar232._12_4_ = fVar230 * auVar43._12_4_;
        auVar55 = vinsertps_avx512f(auVar59,auVar56,0x10);
        auVar46 = vinsertps_avx(auVar58,auVar65,0x10);
        auVar106._0_4_ = auVar55._0_4_ + auVar46._0_4_;
        auVar106._4_4_ = auVar55._4_4_ + auVar46._4_4_;
        auVar106._8_4_ = auVar55._8_4_ + auVar46._8_4_;
        auVar106._12_4_ = auVar55._12_4_ + auVar46._12_4_;
        auVar23._8_4_ = 0x3f000000;
        auVar23._0_8_ = 0x3f0000003f000000;
        auVar23._12_4_ = 0x3f000000;
        auVar52 = vmulps_avx512vl(auVar106,auVar23);
        auVar61 = vshufps_avx(auVar52,auVar52,0x54);
        uVar101 = auVar52._0_4_;
        auVar120._4_4_ = uVar101;
        auVar120._0_4_ = uVar101;
        auVar120._8_4_ = uVar101;
        auVar120._12_4_ = uVar101;
        auVar47 = vfmadd213ps_avx512vl(local_158,auVar120,auVar45);
        auVar44 = vfmadd213ps_fma(local_168,auVar120,auVar54);
        auVar64 = vfmadd213ps_fma(local_178,auVar120,auVar60);
        auVar43 = vsubps_avx(auVar44,auVar47);
        auVar47 = vfmadd213ps_fma(auVar43,auVar120,auVar47);
        auVar43 = vsubps_avx(auVar64,auVar44);
        auVar43 = vfmadd213ps_fma(auVar43,auVar120,auVar44);
        auVar43 = vsubps_avx(auVar43,auVar47);
        auVar44 = vfmadd231ps_fma(auVar47,auVar43,auVar120);
        auVar121._0_8_ = CONCAT44(auVar43._4_4_ * 3.0,auVar43._0_4_ * 3.0);
        auVar121._8_4_ = auVar43._8_4_ * 3.0;
        auVar121._12_4_ = auVar43._12_4_ * 3.0;
        auVar241._8_8_ = auVar44._0_8_;
        auVar241._0_8_ = auVar44._0_8_;
        auVar43 = vshufpd_avx(auVar44,auVar44,3);
        auVar44 = vshufps_avx(auVar52,auVar52,0x55);
        auVar64 = vsubps_avx(auVar43,auVar241);
        auVar47 = vfmadd231ps_fma(auVar241,auVar44,auVar64);
        auVar261._8_8_ = auVar121._0_8_;
        auVar261._0_8_ = auVar121._0_8_;
        auVar43 = vshufpd_avx(auVar121,auVar121,3);
        auVar43 = vsubps_avx(auVar43,auVar261);
        auVar44 = vfmadd213ps_fma(auVar43,auVar44,auVar261);
        auVar122._0_8_ = auVar64._0_8_ ^ 0x8000000080000000;
        auVar122._8_4_ = auVar64._8_4_ ^ 0x80000000;
        auVar122._12_4_ = auVar64._12_4_ ^ 0x80000000;
        auVar43 = vmovshdup_avx(auVar44);
        auVar262._0_8_ = auVar43._0_8_ ^ 0x8000000080000000;
        auVar262._8_4_ = auVar43._8_4_ ^ 0x80000000;
        auVar262._12_4_ = auVar43._12_4_ ^ 0x80000000;
        auVar48 = vmovshdup_avx512vl(auVar64);
        auVar49 = vpermt2ps_avx512vl(auVar262,ZEXT416(5),auVar64);
        auVar43 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar43._0_4_ * auVar64._0_4_)),auVar44,auVar48
                                     );
        auVar44 = vpermt2ps_avx512vl(auVar44,SUB6416(ZEXT464(4),0),auVar122);
        auVar130._0_4_ = auVar43._0_4_;
        auVar130._4_4_ = auVar130._0_4_;
        auVar130._8_4_ = auVar130._0_4_;
        auVar130._12_4_ = auVar130._0_4_;
        auVar43 = vdivps_avx(auVar49,auVar130);
        auVar44 = vdivps_avx(auVar44,auVar130);
        fVar211 = auVar47._0_4_;
        auVar64 = vshufps_avx(auVar47,auVar47,0x55);
        fVar230 = auVar44._0_4_;
        auVar242._0_4_ = fVar211 * auVar43._0_4_ + auVar64._0_4_ * fVar230;
        auVar242._4_4_ = fVar211 * auVar43._4_4_ + auVar64._4_4_ * auVar44._4_4_;
        auVar242._8_4_ = fVar211 * auVar43._8_4_ + auVar64._8_4_ * auVar44._8_4_;
        auVar242._12_4_ = fVar211 * auVar43._12_4_ + auVar64._12_4_ * auVar44._12_4_;
        auVar53 = vsubps_avx(auVar61,auVar242);
        auVar47 = vmovshdup_avx(auVar43);
        auVar61 = vinsertps_avx(auVar199,auVar218,0x1c);
        auVar263._0_4_ = auVar47._0_4_ * auVar61._0_4_;
        auVar263._4_4_ = auVar47._4_4_ * auVar61._4_4_;
        auVar263._8_4_ = auVar47._8_4_ * auVar61._8_4_;
        auVar263._12_4_ = auVar47._12_4_ * auVar61._12_4_;
        auVar64 = vinsertps_avx(auVar184,auVar232,0x1c);
        auVar243._0_4_ = auVar47._0_4_ * auVar64._0_4_;
        auVar243._4_4_ = auVar47._4_4_ * auVar64._4_4_;
        auVar243._8_4_ = auVar47._8_4_ * auVar64._8_4_;
        auVar243._12_4_ = auVar47._12_4_ * auVar64._12_4_;
        auVar51 = vminps_avx512vl(auVar263,auVar243);
        auVar49 = vmaxps_avx(auVar243,auVar263);
        auVar50 = vmovshdup_avx(auVar44);
        auVar47 = vinsertps_avx(auVar218,auVar199,0x4c);
        auVar219._0_4_ = auVar50._0_4_ * auVar47._0_4_;
        auVar219._4_4_ = auVar50._4_4_ * auVar47._4_4_;
        auVar219._8_4_ = auVar50._8_4_ * auVar47._8_4_;
        auVar219._12_4_ = auVar50._12_4_ * auVar47._12_4_;
        auVar48 = vinsertps_avx(auVar232,auVar184,0x4c);
        auVar233._0_4_ = auVar50._0_4_ * auVar48._0_4_;
        auVar233._4_4_ = auVar50._4_4_ * auVar48._4_4_;
        auVar233._8_4_ = auVar50._8_4_ * auVar48._8_4_;
        auVar233._12_4_ = auVar50._12_4_ * auVar48._12_4_;
        auVar50 = vminps_avx(auVar219,auVar233);
        auVar51 = vaddps_avx512vl(auVar51,auVar50);
        auVar50 = vmaxps_avx(auVar233,auVar219);
        auVar220._0_4_ = auVar49._0_4_ + auVar50._0_4_;
        auVar220._4_4_ = auVar49._4_4_ + auVar50._4_4_;
        auVar220._8_4_ = auVar49._8_4_ + auVar50._8_4_;
        auVar220._12_4_ = auVar49._12_4_ + auVar50._12_4_;
        auVar234._8_8_ = 0x3f80000000000000;
        auVar234._0_8_ = 0x3f80000000000000;
        auVar49 = vsubps_avx(auVar234,auVar220);
        auVar50 = vsubps_avx(auVar234,auVar51);
        auVar51 = vsubps_avx(auVar55,auVar52);
        auVar52 = vsubps_avx(auVar46,auVar52);
        fVar228 = auVar51._0_4_;
        auVar264._0_4_ = fVar228 * auVar49._0_4_;
        fVar229 = auVar51._4_4_;
        auVar264._4_4_ = fVar229 * auVar49._4_4_;
        fVar124 = auVar51._8_4_;
        auVar264._8_4_ = fVar124 * auVar49._8_4_;
        fVar134 = auVar51._12_4_;
        auVar264._12_4_ = fVar134 * auVar49._12_4_;
        auVar66 = vbroadcastss_avx512vl(auVar43);
        auVar61 = vmulps_avx512vl(auVar66,auVar61);
        auVar64 = vmulps_avx512vl(auVar66,auVar64);
        auVar66 = vminps_avx512vl(auVar61,auVar64);
        auVar61 = vmaxps_avx(auVar64,auVar61);
        auVar200._0_4_ = fVar230 * auVar47._0_4_;
        auVar200._4_4_ = fVar230 * auVar47._4_4_;
        auVar200._8_4_ = fVar230 * auVar47._8_4_;
        auVar200._12_4_ = fVar230 * auVar47._12_4_;
        auVar185._0_4_ = fVar230 * auVar48._0_4_;
        auVar185._4_4_ = fVar230 * auVar48._4_4_;
        auVar185._8_4_ = fVar230 * auVar48._8_4_;
        auVar185._12_4_ = fVar230 * auVar48._12_4_;
        auVar64 = vminps_avx(auVar200,auVar185);
        auVar47 = vaddps_avx512vl(auVar66,auVar64);
        auVar48 = vmulps_avx512vl(auVar51,auVar50);
        fVar211 = auVar52._0_4_;
        auVar221._0_4_ = fVar211 * auVar49._0_4_;
        fVar225 = auVar52._4_4_;
        auVar221._4_4_ = fVar225 * auVar49._4_4_;
        fVar226 = auVar52._8_4_;
        auVar221._8_4_ = fVar226 * auVar49._8_4_;
        fVar227 = auVar52._12_4_;
        auVar221._12_4_ = fVar227 * auVar49._12_4_;
        auVar235._0_4_ = fVar211 * auVar50._0_4_;
        auVar235._4_4_ = fVar225 * auVar50._4_4_;
        auVar235._8_4_ = fVar226 * auVar50._8_4_;
        auVar235._12_4_ = fVar227 * auVar50._12_4_;
        auVar64 = vmaxps_avx(auVar185,auVar200);
        auVar186._0_4_ = auVar61._0_4_ + auVar64._0_4_;
        auVar186._4_4_ = auVar61._4_4_ + auVar64._4_4_;
        auVar186._8_4_ = auVar61._8_4_ + auVar64._8_4_;
        auVar186._12_4_ = auVar61._12_4_ + auVar64._12_4_;
        auVar201._8_8_ = 0x3f800000;
        auVar201._0_8_ = 0x3f800000;
        auVar61 = vsubps_avx(auVar201,auVar186);
        auVar64 = vsubps_avx(auVar201,auVar47);
        auVar252._0_4_ = fVar228 * auVar61._0_4_;
        auVar252._4_4_ = fVar229 * auVar61._4_4_;
        auVar252._8_4_ = fVar124 * auVar61._8_4_;
        auVar252._12_4_ = fVar134 * auVar61._12_4_;
        auVar244._0_4_ = fVar228 * auVar64._0_4_;
        auVar244._4_4_ = fVar229 * auVar64._4_4_;
        auVar244._8_4_ = fVar124 * auVar64._8_4_;
        auVar244._12_4_ = fVar134 * auVar64._12_4_;
        auVar187._0_4_ = fVar211 * auVar61._0_4_;
        auVar187._4_4_ = fVar225 * auVar61._4_4_;
        auVar187._8_4_ = fVar226 * auVar61._8_4_;
        auVar187._12_4_ = fVar227 * auVar61._12_4_;
        auVar202._0_4_ = fVar211 * auVar64._0_4_;
        auVar202._4_4_ = fVar225 * auVar64._4_4_;
        auVar202._8_4_ = fVar226 * auVar64._8_4_;
        auVar202._12_4_ = fVar227 * auVar64._12_4_;
        auVar61 = vminps_avx(auVar252,auVar244);
        auVar64 = vminps_avx(auVar187,auVar202);
        auVar47 = vminps_avx(auVar61,auVar64);
        auVar61 = vmaxps_avx(auVar244,auVar252);
        auVar64 = vmaxps_avx(auVar202,auVar187);
        auVar64 = vmaxps_avx(auVar64,auVar61);
        auVar49 = vminps_avx512vl(auVar264,auVar48);
        auVar61 = vminps_avx(auVar221,auVar235);
        auVar61 = vminps_avx(auVar49,auVar61);
        auVar61 = vhaddps_avx(auVar47,auVar61);
        auVar48 = vmaxps_avx512vl(auVar48,auVar264);
        auVar47 = vmaxps_avx(auVar235,auVar221);
        auVar47 = vmaxps_avx(auVar47,auVar48);
        auVar64 = vhaddps_avx(auVar64,auVar47);
        auVar61 = vshufps_avx(auVar61,auVar61,0xe8);
        auVar64 = vshufps_avx(auVar64,auVar64,0xe8);
        auVar188._0_4_ = auVar61._0_4_ + auVar53._0_4_;
        auVar188._4_4_ = auVar61._4_4_ + auVar53._4_4_;
        auVar188._8_4_ = auVar61._8_4_ + auVar53._8_4_;
        auVar188._12_4_ = auVar61._12_4_ + auVar53._12_4_;
        auVar203._0_4_ = auVar64._0_4_ + auVar53._0_4_;
        auVar203._4_4_ = auVar64._4_4_ + auVar53._4_4_;
        auVar203._8_4_ = auVar64._8_4_ + auVar53._8_4_;
        auVar203._12_4_ = auVar64._12_4_ + auVar53._12_4_;
        auVar61 = vmaxps_avx(auVar55,auVar188);
        auVar64 = vminps_avx(auVar203,auVar46);
        uVar42 = vcmpps_avx512vl(auVar64,auVar61,1);
        auVar61 = vinsertps_avx(auVar56,auVar65,0x10);
        auVar246 = ZEXT1664(auVar61);
        if ((uVar42 & 3) == 0) {
          vucomiss_avx512f(auVar59);
          auVar272 = ZEXT1664(auVar137);
          if (uVar40 < 4 && (uVar6 == 0 || lVar37 == 0)) {
            bVar13 = false;
          }
          else {
            lVar37 = 200;
            do {
              auVar64 = vsubss_avx512f(auVar62,auVar53);
              fVar226 = auVar64._0_4_;
              fVar211 = fVar226 * fVar226 * fVar226;
              fVar227 = auVar53._0_4_;
              fVar225 = fVar227 * 3.0 * fVar226 * fVar226;
              fVar226 = fVar226 * fVar227 * fVar227 * 3.0;
              auVar159._4_4_ = fVar211;
              auVar159._0_4_ = fVar211;
              auVar159._8_4_ = fVar211;
              auVar159._12_4_ = fVar211;
              auVar143._4_4_ = fVar225;
              auVar143._0_4_ = fVar225;
              auVar143._8_4_ = fVar225;
              auVar143._12_4_ = fVar225;
              auVar113._4_4_ = fVar226;
              auVar113._0_4_ = fVar226;
              auVar113._8_4_ = fVar226;
              auVar113._12_4_ = fVar226;
              fVar227 = fVar227 * fVar227 * fVar227;
              auVar174._0_4_ = (float)local_358._0_4_ * fVar227;
              auVar174._4_4_ = (float)local_358._4_4_ * fVar227;
              auVar174._8_4_ = fStack_350 * fVar227;
              auVar174._12_4_ = fStack_34c * fVar227;
              auVar64 = vfmadd231ps_fma(auVar174,auVar60,auVar113);
              auVar64 = vfmadd231ps_avx512vl(auVar64,auVar54,auVar143);
              auVar64 = vfmadd231ps_avx512vl(auVar64,auVar45,auVar159);
              auVar114._8_8_ = auVar64._0_8_;
              auVar114._0_8_ = auVar64._0_8_;
              auVar64 = vshufpd_avx(auVar64,auVar64,3);
              auVar46 = vshufps_avx(auVar53,auVar53,0x55);
              auVar64 = vsubps_avx(auVar64,auVar114);
              auVar46 = vfmadd213ps_fma(auVar64,auVar46,auVar114);
              fVar211 = auVar46._0_4_;
              auVar64 = vshufps_avx(auVar46,auVar46,0x55);
              auVar115._0_4_ = auVar43._0_4_ * fVar211 + fVar230 * auVar64._0_4_;
              auVar115._4_4_ = auVar43._4_4_ * fVar211 + auVar44._4_4_ * auVar64._4_4_;
              auVar115._8_4_ = auVar43._8_4_ * fVar211 + auVar44._8_4_ * auVar64._8_4_;
              auVar115._12_4_ = auVar43._12_4_ * fVar211 + auVar44._12_4_ * auVar64._12_4_;
              auVar53 = vsubps_avx(auVar53,auVar115);
              auVar64 = vandps_avx512vl(auVar46,auVar271._0_16_);
              auVar46 = vprolq_avx512vl(auVar64,0x20);
              auVar64 = vmaxss_avx(auVar46,auVar64);
              bVar16 = auVar64._0_4_ <= (float)local_368._0_4_;
              if (auVar64._0_4_ < (float)local_368._0_4_) {
                auVar43 = vucomiss_avx512f(auVar57);
                if (bVar16) {
                  auVar44 = vucomiss_avx512f(auVar43);
                  auVar273 = ZEXT1664(auVar44);
                  if (bVar16) {
                    vmovshdup_avx(auVar43);
                    auVar44 = vucomiss_avx512f(auVar57);
                    if (bVar16) {
                      auVar62 = vucomiss_avx512f(auVar44);
                      auVar273 = ZEXT1664(auVar62);
                      if (bVar16) {
                        auVar64 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                                ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),
                                                0x1c);
                        auVar52 = vinsertps_avx(auVar64,ZEXT416((uint)pre->ray_space[k].vz.field_0.
                                                                      m128[2]),0x28);
                        auVar64 = vdpps_avx(auVar52,local_188,0x7f);
                        auVar46 = vdpps_avx(auVar52,local_198,0x7f);
                        auVar47 = vdpps_avx(auVar52,local_1a8,0x7f);
                        auVar48 = vdpps_avx(auVar52,local_1b8,0x7f);
                        auVar49 = vdpps_avx(auVar52,local_1c8,0x7f);
                        auVar50 = vdpps_avx(auVar52,local_1d8,0x7f);
                        auVar51 = vdpps_avx(auVar52,local_1e8,0x7f);
                        auVar52 = vdpps_avx(auVar52,local_1f8,0x7f);
                        auVar53 = vsubss_avx512f(auVar62,auVar44);
                        fVar226 = auVar44._0_4_;
                        auVar44 = vfmadd231ss_fma(ZEXT416((uint)(fVar226 * auVar49._0_4_)),auVar53,
                                                  auVar64);
                        auVar64 = vfmadd231ss_fma(ZEXT416((uint)(auVar50._0_4_ * fVar226)),auVar53,
                                                  auVar46);
                        auVar46 = vfmadd231ss_fma(ZEXT416((uint)(auVar51._0_4_ * fVar226)),auVar53,
                                                  auVar47);
                        auVar47 = vfmadd231ss_fma(ZEXT416((uint)(fVar226 * auVar52._0_4_)),auVar53,
                                                  auVar48);
                        auVar62 = vsubss_avx512f(auVar62,auVar43);
                        auVar207._0_4_ = auVar62._0_4_;
                        fVar230 = auVar207._0_4_ * auVar207._0_4_ * auVar207._0_4_;
                        local_f8 = auVar43._0_4_;
                        fVar211 = local_f8 * 3.0 * auVar207._0_4_ * auVar207._0_4_;
                        fVar225 = auVar207._0_4_ * local_f8 * local_f8 * 3.0;
                        fVar228 = local_f8 * local_f8 * local_f8;
                        auVar62 = vfmadd231ss_fma(ZEXT416((uint)(fVar228 * auVar47._0_4_)),
                                                  ZEXT416((uint)fVar225),auVar46);
                        auVar62 = vfmadd231ss_fma(auVar62,ZEXT416((uint)fVar211),auVar64);
                        auVar44 = vfmadd231ss_fma(auVar62,ZEXT416((uint)fVar230),auVar44);
                        fVar227 = auVar44._0_4_;
                        if ((fVar100 <= fVar227) &&
                           (fVar229 = *(float *)(ray + k * 4 + 0x80), fVar227 <= fVar229)) {
                          local_e8 = vshufps_avx(auVar43,auVar43,0x55);
                          auVar64 = vsubps_avx512vl(auVar137,local_e8);
                          fVar124 = local_e8._0_4_;
                          auVar222._0_4_ = fVar124 * (float)local_248._0_4_;
                          fVar134 = local_e8._4_4_;
                          auVar222._4_4_ = fVar134 * (float)local_248._4_4_;
                          fVar135 = local_e8._8_4_;
                          auVar222._8_4_ = fVar135 * fStack_240;
                          fVar136 = local_e8._12_4_;
                          auVar222._12_4_ = fVar136 * fStack_23c;
                          auVar236._0_4_ = fVar124 * (float)local_258._0_4_;
                          auVar236._4_4_ = fVar134 * (float)local_258._4_4_;
                          auVar236._8_4_ = fVar135 * fStack_250;
                          auVar236._12_4_ = fVar136 * fStack_24c;
                          auVar245._0_4_ = fVar124 * (float)local_268._0_4_;
                          auVar245._4_4_ = fVar134 * (float)local_268._4_4_;
                          auVar245._8_4_ = fVar135 * fStack_260;
                          auVar245._12_4_ = fVar136 * fStack_25c;
                          auVar253._0_4_ = fVar124 * (float)local_278._0_4_;
                          auVar253._4_4_ = fVar134 * (float)local_278._4_4_;
                          auVar253._8_4_ = fVar135 * fStack_270;
                          auVar253._12_4_ = fVar136 * fStack_26c;
                          auVar43 = vfmadd231ps_fma(auVar222,auVar64,local_208);
                          auVar44 = vfmadd231ps_fma(auVar236,auVar64,local_218);
                          auVar62 = vfmadd231ps_fma(auVar245,auVar64,local_228);
                          auVar64 = vfmadd231ps_fma(auVar253,auVar64,local_238);
                          auVar43 = vsubps_avx(auVar44,auVar43);
                          auVar44 = vsubps_avx(auVar62,auVar44);
                          auVar62 = vsubps_avx(auVar64,auVar62);
                          auVar254._0_4_ = local_f8 * auVar44._0_4_;
                          auVar254._4_4_ = local_f8 * auVar44._4_4_;
                          auVar254._8_4_ = local_f8 * auVar44._8_4_;
                          auVar254._12_4_ = local_f8 * auVar44._12_4_;
                          auVar207._4_4_ = auVar207._0_4_;
                          auVar207._8_4_ = auVar207._0_4_;
                          auVar207._12_4_ = auVar207._0_4_;
                          auVar43 = vfmadd231ps_fma(auVar254,auVar207,auVar43);
                          auVar223._0_4_ = local_f8 * auVar62._0_4_;
                          auVar223._4_4_ = local_f8 * auVar62._4_4_;
                          auVar223._8_4_ = local_f8 * auVar62._8_4_;
                          auVar223._12_4_ = local_f8 * auVar62._12_4_;
                          auVar44 = vfmadd231ps_fma(auVar223,auVar207,auVar44);
                          auVar224._0_4_ = local_f8 * auVar44._0_4_;
                          auVar224._4_4_ = local_f8 * auVar44._4_4_;
                          auVar224._8_4_ = local_f8 * auVar44._8_4_;
                          auVar224._12_4_ = local_f8 * auVar44._12_4_;
                          auVar43 = vfmadd231ps_fma(auVar224,auVar207,auVar43);
                          auVar24._8_4_ = 0x40400000;
                          auVar24._0_8_ = 0x4040000040400000;
                          auVar24._12_4_ = 0x40400000;
                          auVar43 = vmulps_avx512vl(auVar43,auVar24);
                          pGVar7 = (context->scene->geometries).items[uVar33].ptr;
                          if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                            auVar189._0_4_ = fVar228 * (float)local_2b8._0_4_;
                            auVar189._4_4_ = fVar228 * (float)local_2b8._4_4_;
                            auVar189._8_4_ = fVar228 * fStack_2b0;
                            auVar189._12_4_ = fVar228 * fStack_2ac;
                            auVar175._4_4_ = fVar225;
                            auVar175._0_4_ = fVar225;
                            auVar175._8_4_ = fVar225;
                            auVar175._12_4_ = fVar225;
                            auVar44 = vfmadd132ps_fma(auVar175,auVar189,local_2a8);
                            auVar160._4_4_ = fVar211;
                            auVar160._0_4_ = fVar211;
                            auVar160._8_4_ = fVar211;
                            auVar160._12_4_ = fVar211;
                            auVar44 = vfmadd132ps_fma(auVar160,auVar44,local_298);
                            auVar144._4_4_ = fVar230;
                            auVar144._0_4_ = fVar230;
                            auVar144._8_4_ = fVar230;
                            auVar144._12_4_ = fVar230;
                            auVar64 = vfmadd132ps_fma(auVar144,auVar44,local_288);
                            auVar44 = vshufps_avx(auVar64,auVar64,0xc9);
                            auVar62 = vshufps_avx(auVar43,auVar43,0xc9);
                            auVar145._0_4_ = auVar64._0_4_ * auVar62._0_4_;
                            auVar145._4_4_ = auVar64._4_4_ * auVar62._4_4_;
                            auVar145._8_4_ = auVar64._8_4_ * auVar62._8_4_;
                            auVar145._12_4_ = auVar64._12_4_ * auVar62._12_4_;
                            auVar43 = vfmsub231ps_fma(auVar145,auVar43,auVar44);
                            auVar246 = ZEXT1664(auVar61);
                            local_108 = auVar43._0_4_;
                            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                               (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                              *(float *)(ray + k * 4 + 0x80) = fVar227;
                              uVar101 = vextractps_avx(auVar43,1);
                              *(undefined4 *)(ray + k * 4 + 0xc0) = uVar101;
                              uVar101 = vextractps_avx(auVar43,2);
                              *(undefined4 *)(ray + k * 4 + 0xd0) = uVar101;
                              *(undefined4 *)(ray + k * 4 + 0xe0) = local_108;
                              *(float *)(ray + k * 4 + 0xf0) = local_f8;
                              *(float *)(ray + k * 4 + 0x100) = fVar226;
                              *(uint *)(ray + k * 4 + 0x110) = uVar38;
                              *(int *)(ray + k * 4 + 0x120) = (int)uVar33;
                              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                            }
                            else {
                              auVar44 = vshufps_avx(auVar43,auVar43,0x55);
                              local_118 = vshufps_avx(auVar43,auVar43,0xaa);
                              local_128[0] = (RTCHitN)auVar44[0];
                              local_128[1] = (RTCHitN)auVar44[1];
                              local_128[2] = (RTCHitN)auVar44[2];
                              local_128[3] = (RTCHitN)auVar44[3];
                              local_128[4] = (RTCHitN)auVar44[4];
                              local_128[5] = (RTCHitN)auVar44[5];
                              local_128[6] = (RTCHitN)auVar44[6];
                              local_128[7] = (RTCHitN)auVar44[7];
                              local_128[8] = (RTCHitN)auVar44[8];
                              local_128[9] = (RTCHitN)auVar44[9];
                              local_128[10] = (RTCHitN)auVar44[10];
                              local_128[0xb] = (RTCHitN)auVar44[0xb];
                              local_128[0xc] = (RTCHitN)auVar44[0xc];
                              local_128[0xd] = (RTCHitN)auVar44[0xd];
                              local_128[0xe] = (RTCHitN)auVar44[0xe];
                              local_128[0xf] = (RTCHitN)auVar44[0xf];
                              uStack_104 = local_108;
                              uStack_100 = local_108;
                              uStack_fc = local_108;
                              fStack_f4 = local_f8;
                              fStack_f0 = local_f8;
                              fStack_ec = local_f8;
                              local_d8 = local_2e8._0_8_;
                              uStack_d0 = local_2e8._8_8_;
                              local_c8 = local_2d8;
                              vpcmpeqd_avx2(ZEXT1632(local_2d8),ZEXT1632(local_2d8));
                              uStack_b4 = context->user->instID[0];
                              local_b8 = uStack_b4;
                              uStack_b0 = uStack_b4;
                              uStack_ac = uStack_b4;
                              uStack_a8 = context->user->instPrimID[0];
                              uStack_a4 = uStack_a8;
                              uStack_a0 = uStack_a8;
                              uStack_9c = uStack_a8;
                              *(float *)(ray + k * 4 + 0x80) = fVar227;
                              local_3b8 = local_2f8._0_8_;
                              uStack_3b0 = local_2f8._8_8_;
                              local_398.valid = (int *)&local_3b8;
                              local_398.geometryUserPtr = pGVar7->userPtr;
                              local_398.context = context->user;
                              local_398.hit = local_128;
                              local_398.N = 4;
                              local_398.ray = (RTCRayN *)ray;
                              if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                                local_3a8 = uVar33;
                                (*pGVar7->intersectionFilterN)(&local_398);
                                in_ZMM23 = ZEXT464(0x38d1b717);
                                auVar85 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                auVar270 = ZEXT3264(auVar85);
                                auVar273 = ZEXT464(0x3f800000);
                                auVar43 = vxorps_avx512vl(auVar57,auVar57);
                                auVar275 = ZEXT1664(auVar43);
                                auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                auVar271 = ZEXT1664(auVar43);
                                uVar33 = local_3a8;
                              }
                              auVar43 = auVar275._0_16_;
                              auVar29._8_8_ = uStack_3b0;
                              auVar29._0_8_ = local_3b8;
                              uVar42 = vptestmd_avx512vl(auVar29,auVar29);
                              if ((uVar42 & 0xf) == 0) {
LAB_01c5b8a6:
                                *(float *)(ray + k * 4 + 0x80) = fVar229;
                              }
                              else {
                                p_Var12 = context->args->filter;
                                if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                                   (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                                  (*p_Var12)(&local_398);
                                  in_ZMM23 = ZEXT464(0x38d1b717);
                                  auVar85 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  auVar270 = ZEXT3264(auVar85);
                                  auVar273 = ZEXT464(0x3f800000);
                                  auVar43 = vxorps_avx512vl(auVar43,auVar43);
                                  auVar275 = ZEXT1664(auVar43);
                                  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar271 = ZEXT1664(auVar43);
                                }
                                auVar30._8_8_ = uStack_3b0;
                                auVar30._0_8_ = local_3b8;
                                uVar42 = vptestmd_avx512vl(auVar30,auVar30);
                                uVar42 = uVar42 & 0xf;
                                bVar31 = (byte)uVar42;
                                if (bVar31 == 0) goto LAB_01c5b8a6;
                                iVar99 = *(int *)(local_398.hit + 4);
                                iVar274 = *(int *)(local_398.hit + 8);
                                iVar28 = *(int *)(local_398.hit + 0xc);
                                bVar16 = (bool)((byte)(uVar42 >> 1) & 1);
                                bVar14 = (bool)((byte)(uVar42 >> 2) & 1);
                                bVar15 = SUB81(uVar42 >> 3,0);
                                *(uint *)(local_398.ray + 0xc0) =
                                     (uint)(bVar31 & 1) * *(int *)local_398.hit |
                                     (uint)!(bool)(bVar31 & 1) * *(int *)(local_398.ray + 0xc0);
                                *(uint *)(local_398.ray + 0xc4) =
                                     (uint)bVar16 * iVar99 |
                                     (uint)!bVar16 * *(int *)(local_398.ray + 0xc4);
                                *(uint *)(local_398.ray + 200) =
                                     (uint)bVar14 * iVar274 |
                                     (uint)!bVar14 * *(int *)(local_398.ray + 200);
                                *(uint *)(local_398.ray + 0xcc) =
                                     (uint)bVar15 * iVar28 |
                                     (uint)!bVar15 * *(int *)(local_398.ray + 0xcc);
                                iVar99 = *(int *)(local_398.hit + 0x14);
                                iVar274 = *(int *)(local_398.hit + 0x18);
                                iVar28 = *(int *)(local_398.hit + 0x1c);
                                bVar16 = (bool)((byte)(uVar42 >> 1) & 1);
                                bVar14 = (bool)((byte)(uVar42 >> 2) & 1);
                                bVar15 = SUB81(uVar42 >> 3,0);
                                *(uint *)(local_398.ray + 0xd0) =
                                     (uint)(bVar31 & 1) * *(int *)(local_398.hit + 0x10) |
                                     (uint)!(bool)(bVar31 & 1) * *(int *)(local_398.ray + 0xd0);
                                *(uint *)(local_398.ray + 0xd4) =
                                     (uint)bVar16 * iVar99 |
                                     (uint)!bVar16 * *(int *)(local_398.ray + 0xd4);
                                *(uint *)(local_398.ray + 0xd8) =
                                     (uint)bVar14 * iVar274 |
                                     (uint)!bVar14 * *(int *)(local_398.ray + 0xd8);
                                *(uint *)(local_398.ray + 0xdc) =
                                     (uint)bVar15 * iVar28 |
                                     (uint)!bVar15 * *(int *)(local_398.ray + 0xdc);
                                iVar99 = *(int *)(local_398.hit + 0x24);
                                iVar274 = *(int *)(local_398.hit + 0x28);
                                iVar28 = *(int *)(local_398.hit + 0x2c);
                                bVar16 = (bool)((byte)(uVar42 >> 1) & 1);
                                bVar14 = (bool)((byte)(uVar42 >> 2) & 1);
                                bVar15 = SUB81(uVar42 >> 3,0);
                                *(uint *)(local_398.ray + 0xe0) =
                                     (uint)(bVar31 & 1) * *(int *)(local_398.hit + 0x20) |
                                     (uint)!(bool)(bVar31 & 1) * *(int *)(local_398.ray + 0xe0);
                                *(uint *)(local_398.ray + 0xe4) =
                                     (uint)bVar16 * iVar99 |
                                     (uint)!bVar16 * *(int *)(local_398.ray + 0xe4);
                                *(uint *)(local_398.ray + 0xe8) =
                                     (uint)bVar14 * iVar274 |
                                     (uint)!bVar14 * *(int *)(local_398.ray + 0xe8);
                                *(uint *)(local_398.ray + 0xec) =
                                     (uint)bVar15 * iVar28 |
                                     (uint)!bVar15 * *(int *)(local_398.ray + 0xec);
                                iVar99 = *(int *)(local_398.hit + 0x34);
                                iVar274 = *(int *)(local_398.hit + 0x38);
                                iVar28 = *(int *)(local_398.hit + 0x3c);
                                bVar16 = (bool)((byte)(uVar42 >> 1) & 1);
                                bVar14 = (bool)((byte)(uVar42 >> 2) & 1);
                                bVar15 = SUB81(uVar42 >> 3,0);
                                *(uint *)(local_398.ray + 0xf0) =
                                     (uint)(bVar31 & 1) * *(int *)(local_398.hit + 0x30) |
                                     (uint)!(bool)(bVar31 & 1) * *(int *)(local_398.ray + 0xf0);
                                *(uint *)(local_398.ray + 0xf4) =
                                     (uint)bVar16 * iVar99 |
                                     (uint)!bVar16 * *(int *)(local_398.ray + 0xf4);
                                *(uint *)(local_398.ray + 0xf8) =
                                     (uint)bVar14 * iVar274 |
                                     (uint)!bVar14 * *(int *)(local_398.ray + 0xf8);
                                *(uint *)(local_398.ray + 0xfc) =
                                     (uint)bVar15 * iVar28 |
                                     (uint)!bVar15 * *(int *)(local_398.ray + 0xfc);
                                iVar99 = *(int *)(local_398.hit + 0x44);
                                iVar274 = *(int *)(local_398.hit + 0x48);
                                iVar28 = *(int *)(local_398.hit + 0x4c);
                                bVar16 = (bool)((byte)(uVar42 >> 1) & 1);
                                bVar14 = (bool)((byte)(uVar42 >> 2) & 1);
                                bVar15 = SUB81(uVar42 >> 3,0);
                                *(uint *)(local_398.ray + 0x100) =
                                     (uint)(bVar31 & 1) * *(int *)(local_398.hit + 0x40) |
                                     (uint)!(bool)(bVar31 & 1) * *(int *)(local_398.ray + 0x100);
                                *(uint *)(local_398.ray + 0x104) =
                                     (uint)bVar16 * iVar99 |
                                     (uint)!bVar16 * *(int *)(local_398.ray + 0x104);
                                *(uint *)(local_398.ray + 0x108) =
                                     (uint)bVar14 * iVar274 |
                                     (uint)!bVar14 * *(int *)(local_398.ray + 0x108);
                                *(uint *)(local_398.ray + 0x10c) =
                                     (uint)bVar15 * iVar28 |
                                     (uint)!bVar15 * *(int *)(local_398.ray + 0x10c);
                                auVar43 = vmovdqu32_avx512vl(*(undefined1 (*) [16])
                                                              (local_398.hit + 0x50));
                                *(undefined1 (*) [16])(local_398.ray + 0x110) = auVar43;
                                auVar43 = vmovdqu32_avx512vl(*(undefined1 (*) [16])
                                                              (local_398.hit + 0x60));
                                *(undefined1 (*) [16])(local_398.ray + 0x120) = auVar43;
                                auVar43 = vmovdqa32_avx512vl(*(undefined1 (*) [16])
                                                              (local_398.hit + 0x70));
                                *(undefined1 (*) [16])(local_398.ray + 0x130) = auVar43;
                                auVar43 = vmovdqa32_avx512vl(*(undefined1 (*) [16])
                                                              (local_398.hit + 0x80));
                                *(undefined1 (*) [16])(local_398.ray + 0x140) = auVar43;
                              }
                              auVar246 = ZEXT1664(auVar61);
                              auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                              auVar272 = ZEXT1664(auVar43);
                            }
                            goto LAB_01c5b4b9;
                          }
                        }
                        auVar246 = ZEXT1664(auVar61);
                        goto LAB_01c5b4b9;
                      }
                    }
                  }
                }
                break;
              }
              lVar37 = lVar37 + -1;
            } while (lVar37 != 0);
          }
        }
        auVar272 = ZEXT1664(auVar137);
      }
LAB_01c5b4b9:
    } while (bVar13);
    auVar43 = vinsertps_avx512f(auVar59,auVar58,0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }